

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::SampleLd
          (VolPathIntegrator *this,Interaction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler,SampledSpectrum *T_hat,SampledSpectrum *pathPDF)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  ushort uVar85;
  Vector3f wiRender;
  Tuple3<pbrt::Point3,_pbrt::Interval> TVar86;
  undefined1 auVar87 [8];
  uint64_t uVar88;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  TVar89;
  undefined1 auVar90 [40];
  bool bVar91;
  int i;
  uint uVar92;
  SurfaceInteraction *pSVar93;
  MediumInteraction *pMVar94;
  byte bVar95;
  uint uVar96;
  int iVar97;
  int *piVar98;
  float *pfVar99;
  float *pfVar100;
  DenselySampledSpectrum *this_00;
  int iVar101;
  Vector3f *pVVar102;
  PowerLightSampler *this_01;
  ulong uVar103;
  int iVar104;
  ulong uVar105;
  int iVar106;
  ulong uVar107;
  float *pfVar108;
  long lVar109;
  int *piVar110;
  int *piVar111;
  HaltonSampler *this_02;
  DebugMLTSampler *this_03;
  undefined8 *puVar112;
  Tuple3<pbrt::Point3,_float> *pTVar113;
  SampledWavelengths *pSVar114;
  int iVar115;
  VolPathIntegrator *pVVar116;
  long in_FS_OFFSET;
  int iVar117;
  int iVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  Float u;
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar127 [16];
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar128 [16];
  undefined8 uVar126;
  undefined8 uVar173;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 extraout_var [12];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined4 extraout_XMM0_Dc;
  undefined8 uVar175;
  undefined1 auVar174 [56];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar156 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar157 [64];
  undefined1 extraout_var_06 [56];
  undefined1 auVar158 [64];
  undefined4 extraout_XMM0_Dc_00;
  undefined1 extraout_var_08 [56];
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_01 [60];
  undefined8 uVar176;
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  Float sum;
  undefined8 uVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar218;
  float fVar220;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar219 [56];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  float fVar221;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined8 uVar222;
  undefined1 auVar236 [64];
  float fVar237;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 in_ZMM3 [64];
  float fVar248;
  float fVar249;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined4 uVar256;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar257;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [64];
  float fVar270;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [64];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  Float t1;
  undefined1 auVar292 [64];
  Float t0;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar296 [12];
  undefined1 in_ZMM12 [64];
  undefined1 auVar295 [64];
  undefined1 in_XMM13 [16];
  SampledSpectrum SVar297;
  Point3f PVar298;
  Vector3f woRender;
  Point3f p;
  Vector3f wiRender_00;
  int voxel [3];
  Float nextCrossingT [3];
  RNG rng;
  int voxelLimit [3];
  int step [3];
  Float deltaT [3];
  SampledSpectrum lightPathPDF;
  SampledSpectrum T_ray;
  SampledSpectrum uniPathPDF;
  optional<pbrt::SampledLight> sampledLight;
  Ray lightRay;
  optional<pbrt::ShapeIntersection> si;
  optional<pbrt::LightLiSample> ls;
  Tuple3<pbrt::Point3,_float> local_62c;
  float local_61c;
  undefined1 local_618 [16];
  Tuple3<pbrt::Point3,_float> local_600;
  int local_5f0 [3];
  float local_5e4 [3];
  undefined1 local_5d8 [8];
  undefined8 uStack_5d0;
  undefined1 local_5c8 [12];
  float fStack_5bc;
  undefined8 uStack_5b8;
  RNG *pRStack_5b0;
  undefined1 local_598 [16];
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  RNG local_578;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  int *local_558;
  int local_54c [4];
  int local_53c;
  int local_538;
  float local_534 [4];
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  SampledWavelengths *local_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  SampledSpectrum local_4e8;
  VolPathIntegrator *local_4d0;
  SampledSpectrum local_4c8;
  undefined1 local_4b8 [8];
  undefined8 uStack_4b0;
  undefined1 auStack_4a8 [16];
  undefined8 local_498;
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  SampledSpectrum local_458;
  undefined1 local_440 [20];
  float fStack_42c;
  Float FStack_428;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  undefined8 local_3f8;
  undefined1 local_3e8 [16];
  anon_class_32_4_3820c045 local_3d0;
  float local_3ac;
  undefined1 local_3a8 [16];
  Interval IStack_398;
  Tuple3<pbrt::Normal3,_float> TStack_390;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float afStack_374 [5];
  undefined1 local_360 [28];
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  float local_328;
  MediumInterface *local_320;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_318;
  PhaseFunctionHandle local_310;
  SampledSpectrum local_308;
  SampledSpectrum local_2f8;
  undefined1 local_2e8 [32];
  SampledSpectrum local_2c8;
  Interval local_2b8;
  Interval IStack_2b0;
  float fStack_2a8;
  float fStack_2a4;
  Float FStack_2a0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_298;
  SampledSpectrum *local_288;
  anon_struct_8_0_00000001_for___align local_280;
  undefined1 local_278 [16];
  undefined1 local_268 [4];
  float afStack_264 [3];
  Interval IStack_258;
  undefined1 auStack_250 [8];
  undefined1 auStack_248 [8];
  undefined8 uStack_240;
  undefined1 auStack_238 [16];
  undefined1 local_228 [64];
  undefined1 local_1e8 [64];
  undefined1 local_1a8 [64];
  ulong local_168;
  array<float,_4> local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  float local_128;
  float afStack_124 [3];
  ulong local_118;
  float local_110;
  float local_10c;
  Interaction local_108;
  char local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  undefined1 auVar121 [16];
  undefined1 auVar164 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_07 [56];
  undefined1 auVar203 [64];
  undefined1 auVar209 [64];
  
  auVar295 = _local_268;
  local_618._8_8_ = local_618._0_8_;
  uStack_5d0 = local_5d8;
  auVar137 = in_ZMM12._0_16_;
  auVar119 = in_ZMM3._0_16_;
  local_288 = T_hat;
  if (bsdf == (BSDF *)0x0) {
    IStack_398 = (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 z;
    IStack_258 = IStack_398;
    local_3a8._0_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    local_3a8._4_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    local_3a8._8_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    local_3a8._12_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    _local_268 = local_3a8;
    auVar236 = _local_268;
    auStack_238 = auVar295._48_16_;
    _local_268 = auVar236._0_40_;
    uStack_240 = 0;
    _local_268 = auVar236._0_24_;
    _auStack_250 = ZEXT816(0) << 0x20;
    fStack_380 = 0.0;
    fStack_37c = 0.0;
    TStack_390.x = 0.0;
    TStack_390.y = 0.0;
    TStack_390.z = 0.0;
    fStack_384 = 0.0;
  }
  else {
    pSVar93 = Interaction::AsSurface(intr);
    auVar90 = _auStack_250;
    TVar86 = (pSVar93->super_Interaction).pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>;
    _local_268 = (undefined1  [24])TVar86;
    auVar295 = _local_268;
    TStack_390.z = (pSVar93->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    _local_268 = auVar295._0_32_;
    auStack_248._0_4_ = TStack_390.z;
    TStack_390.x = (pSVar93->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    TStack_390.y = (pSVar93->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auStack_250._0_4_ = TStack_390.x;
    auStack_250._4_4_ = TStack_390.y;
    auVar295 = _local_268;
    fStack_37c = (pSVar93->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auStack_238 = auVar90._24_16_;
    _local_268 = auVar295._0_44_;
    uStack_240._4_4_ = fStack_37c;
    uVar177._0_4_ = (pSVar93->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar177._4_4_ = (pSVar93->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    _local_268 = auVar295._0_36_;
    stack0xfffffffffffffdbc = uVar177;
    auVar295 = _local_268;
    afStack_264._4_8_ = TVar86.y;
    auVar174 = ZEXT856((ulong)afStack_264._4_8_);
    IStack_258 = TVar86.z;
    IStack_398 = IStack_258;
    local_3a8 = TVar86._0_16_;
    fStack_384 = (float)(undefined4)uVar177;
    fStack_380 = (float)uVar177._4_4_;
    _local_268 = auVar295;
    bVar91 = BSDF::HasReflection(bsdf);
    if ((!bVar91) || (bVar91 = BSDF::HasTransmission(bsdf), bVar91)) {
      bVar91 = BSDF::HasTransmission(bsdf);
      if (bVar91) {
        bVar91 = BSDF::HasReflection(bsdf);
        if (!bVar91) {
          uVar103._0_4_ = (intr->wo).super_Tuple3<pbrt::Vector3,_float>.x;
          uVar103._4_4_ = (intr->wo).super_Tuple3<pbrt::Vector3,_float>.y;
          pVVar102 = (Vector3f *)local_268;
          auVar123._0_8_ = uVar103 ^ 0x8000000080000000;
          auVar123._8_4_ = 0x80000000;
          auVar123._12_4_ = 0x80000000;
          auVar174 = ZEXT856(auVar123._8_8_);
          uVar177 = vmovlps_avx(auVar123);
          afStack_264[1] = -(intr->wo).super_Tuple3<pbrt::Vector3,_float>.z;
          _local_268 = uVar177;
          goto LAB_003ccab5;
        }
      }
    }
    else {
      pVVar102 = &intr->wo;
LAB_003ccab5:
      PVar298 = Interaction::OffsetRayOrigin(intr,pVVar102);
      auVar121._0_4_ = PVar298.super_Tuple3<pbrt::Point3,_float>.z;
      auVar295._0_8_ = PVar298.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar295._8_56_ = auVar174;
      auVar121._4_4_ = auVar121._0_4_;
      auVar121._8_4_ = auVar121._0_4_;
      auVar121._12_4_ = auVar121._0_4_;
      local_3a8 = vshufps_avx(auVar295._0_16_,auVar295._0_16_,0x50);
      IStack_398 = (Interval)vmovlps_avx(auVar121);
    }
  }
  _local_268 = (sampler->
               super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               ).bits;
  local_5d8 = (undefined1  [8])bsdf;
  local_618._0_8_ = intr;
  u = DispatchSplit<9>::operator()
                ((DispatchSplit<9> *)local_360,local_268,(ulong)_local_268 >> 0x30);
  uVar103 = (this->lightSampler).
            super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
            .bits;
  local_4d0 = this;
  if ((ushort)(uVar103 >> 0x30) < 3) {
    this_01 = (PowerLightSampler *)(uVar103 & 0xffffffffffff);
    if ((uVar103 & 0x3000000000000) == 0x2000000000000) {
      PowerLightSampler::Sample((optional<pbrt::SampledLight> *)local_408,this_01,u);
    }
    else {
      sVar4 = (this_01->lights).nStored;
      if (sVar4 == 0) {
        local_408._0_12_ = ZEXT412(0);
        local_408._12_4_ = 0;
        local_3f8._0_1_ = false;
        local_3f8._1_7_ = 0;
        bVar91 = false;
      }
      else {
        auVar119 = vcvtusi2ss_avx512f(auVar119,sVar4);
        iVar117 = (int)sVar4 + -1;
        iVar118 = (int)(u * auVar119._0_4_);
        if (iVar118 <= iVar117) {
          iVar117 = iVar118;
        }
        bVar91 = true;
        local_408._8_4_ = 1.0 / auVar119._0_4_;
        local_408._0_8_ =
             (this_01->lights).ptr[iVar117].
             super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             .bits;
      }
      local_3f8._0_1_ = bVar91;
    }
  }
  else if ((uVar103 & 0xfffe000000000000) == 0x2000000000000) {
    BVHLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_408,
               (BVHLightSampler *)(uVar103 & 0xffffffffffff),(LightSampleContext *)local_3a8,u);
  }
  else {
    ExhaustiveLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_408,
               (ExhaustiveLightSampler *)(uVar103 & 0xffffffffffff),(LightSampleContext *)local_3a8,
               u);
  }
  uVar103 = (sampler->
            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            ).bits;
  uVar85 = (ushort)(uVar103 >> 0x30);
  uVar92 = (uint)uVar85;
  local_510 = lambda;
  if (uVar103 >> 0x30 < 5) {
    if (uVar103 < 0x3000000000000) {
      if (uVar92 == 2) {
        auVar154._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar103 & 0xffffffffffff));
        auVar154._8_56_ = extraout_var_02;
        auVar119 = auVar154._0_16_;
      }
      else {
        auVar157._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar103 & 0xffffffffffff));
        auVar157._8_56_ = extraout_var_05;
        auVar119 = auVar157._0_16_;
      }
    }
    else {
      this_02 = (HaltonSampler *)(uVar103 & 0xffffffffffff);
      if ((uVar92 & 6) == 2) {
        iVar117 = 2;
        if (this_02->dimension < 999) {
          iVar117 = this_02->dimension;
        }
        this_02->dimension = iVar117 + 2;
        local_598._0_4_ = HaltonSampler::SampleDimension(this_02,iVar117);
        lambda = local_510;
        local_598._4_4_ = extraout_XMM0_Db;
        local_598._8_4_ = extraout_XMM0_Dc;
        local_598._12_4_ = extraout_XMM0_Dd;
        auVar156._0_4_ = HaltonSampler::SampleDimension(this_02,iVar117 + 1);
        auVar156._4_60_ = extraout_var_00;
        auVar119 = auVar156._0_16_;
LAB_003ccd07:
        auVar119 = vinsertps_avx(local_598,auVar119,0x10);
      }
      else {
        auVar158._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_02);
        auVar158._8_56_ = extraout_var_07;
        auVar119 = auVar158._0_16_;
      }
    }
  }
  else {
    uVar96 = uVar85 - 4;
    if (uVar96 < 3) {
      if (uVar96 == 2) {
        auVar155._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)(uVar103 & 0xffffffffffff));
        auVar155._8_56_ = extraout_var_03;
        auVar119 = auVar155._0_16_;
      }
      else {
        auVar292._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar103 & 0xffffffffffff));
        auVar292._8_56_ = extraout_var_06;
        auVar119 = auVar292._0_16_;
      }
    }
    else {
      this_03 = (DebugMLTSampler *)(uVar103 & 0xffffffffffff);
      if (uVar92 - 6 < 2) {
        auVar283._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_03);
        auVar283._8_56_ = extraout_var_04;
        auVar119 = auVar283._0_16_;
      }
      else {
        if (uVar92 - 6 != 2) {
          local_598._0_4_ = DebugMLTSampler::Get1D(this_03);
          local_598._4_4_ = extraout_XMM0_Db_00;
          local_598._8_4_ = extraout_XMM0_Dc_00;
          local_598._12_4_ = extraout_XMM0_Dd_00;
          auVar236._0_4_ = DebugMLTSampler::Get1D(this_03);
          auVar236._4_60_ = extraout_var_01;
          auVar119 = auVar236._0_16_;
          goto LAB_003ccd07;
        }
        auVar269._0_8_ = MLTSampler::Get2D((MLTSampler *)this_03);
        auVar269._8_56_ = extraout_var_08;
        auVar119 = auVar269._0_16_;
      }
    }
  }
  auVar295 = _local_268;
  pVVar116 = local_4d0;
  uVar177 = 0;
  uVar222 = 0;
  if (local_3f8._0_1_ != true) goto LAB_003d033d;
  uVar126 = local_408._0_8_;
  if ((anon_struct_8_0_00000001_for___align)local_408._0_8_ ==
      (anon_struct_8_0_00000001_for___align)0x0) {
LAB_003d0356:
    LogFatal<char_const(&)[43]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
               ,0x509,"Check failed: %s",(char (*) [43])"light != nullptr && sampledLight->pdf != 0"
              );
  }
  if (((float)local_408._8_4_ == 0.0) && (!NAN((float)local_408._8_4_))) goto LAB_003d0356;
  auStack_248._4_4_ = fStack_384;
  auStack_248._0_4_ = TStack_390.z;
  uStack_240._4_4_ = fStack_37c;
  uStack_240._0_4_ = fStack_380;
  local_360._16_8_ = local_5c8;
  local_360._8_8_ = &local_2b8;
  local_360._0_8_ = local_268;
  unique0x00005300 = &local_3d0;
  _local_268 = auVar295._0_16_;
  IStack_258 = IStack_398;
  auStack_250._0_4_ = TStack_390.x;
  auStack_250._4_4_ = TStack_390.y;
  auStack_238 = auVar295._48_16_;
  auVar295 = _local_268;
  _local_268 = local_3a8;
  _auStack_248 = auVar295._32_32_;
  auStack_250._0_4_ = TStack_390.x;
  auStack_250._4_4_ = TStack_390.y;
  local_5c8._0_8_ = *(undefined8 *)(lambda->lambda).values;
  uVar177 = *(undefined8 *)((lambda->lambda).values + 2);
  uVar222 = *(undefined8 *)(lambda->pdf).values;
  pRStack_5b0 = *(RNG **)((lambda->pdf).values + 2);
  local_2b8 = (Interval)vmovlps_avx(auVar119);
  local_3d0.T_ray = (SampledSpectrum *)((ulong)local_3d0.T_ray._4_4_ << 0x20);
  local_5c8._8_4_ = (undefined4)uVar177;
  fStack_5bc = (float)((ulong)uVar177 >> 0x20);
  uStack_5b8._0_4_ = (float)uVar222;
  uStack_5b8._4_4_ = (float)((ulong)uVar222 >> 0x20);
  local_440._0_8_ = local_408._0_8_;
  auVar295 = ZEXT1664(auVar137);
  DispatchSplit<9>::operator()
            (&local_128,(DispatchSplit<9> *)&local_378,local_440,(ulong)local_408._0_8_ >> 0x30);
  pSVar114 = local_510;
  uVar177 = 0;
  if (local_b8 == '\x01') {
    if ((local_128 == 0.0) && (!NAN(local_128))) {
      uVar103 = 0xffffffffffffffff;
      do {
        if (uVar103 == 2) goto LAB_003d0339;
        lVar109 = uVar103 + 1;
        uVar103 = uVar103 + 1;
      } while ((afStack_124[lVar109] == 0.0) && (!NAN(afStack_124[lVar109])));
      if (2 < uVar103) goto LAB_003d0339;
    }
    uVar222 = 0;
    if ((local_10c != 0.0) || (NAN(local_10c))) {
      if (local_3f8._0_1_ != false) {
        uVar177 = local_618._0_8_;
        wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_110;
        wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_118;
        wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_118._4_4_;
        auVar87 = local_5d8;
        local_280 = (anon_struct_8_0_00000001_for___align)uVar126;
        local_588._0_4_ = local_110;
        local_598._8_8_ = 0;
        local_598._0_8_ = local_118;
        local_148 = ZEXT416((uint)(local_10c * (float)local_408._8_4_));
        pVVar102 = (Vector3f *)(local_618._0_8_ + 0x1c);
        uVar2 = (pVVar102->super_Tuple3<pbrt::Vector3,_float>).x;
        uVar3 = (pVVar102->super_Tuple3<pbrt::Vector3,_float>).y;
        local_568._0_4_ =
             (((Vector3f *)(local_618._0_8_ + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).z;
        fStack_520 = 0.0;
        fStack_51c = 0.0;
        local_534[3] = (float)uVar2;
        fStack_524 = (float)uVar3;
        if (local_5d8 == (undefined1  [8])0x0) {
          auVar119._0_4_ =
               (((Normal3f *)(local_618._0_8_ + 0x28))->super_Tuple3<pbrt::Normal3,_float>).x;
          if (((((auVar119._0_4_ != 0.0) || (NAN(auVar119._0_4_))) ||
               (auVar119._0_4_ =
                     (((Normal3f *)(local_618._0_8_ + 0x28))->super_Tuple3<pbrt::Normal3,_float>).y,
               auVar119._0_4_ != 0.0)) ||
              ((NAN(auVar119._0_4_) ||
               (auVar119._0_4_ =
                     (((Normal3f *)(local_618._0_8_ + 0x28))->super_Tuple3<pbrt::Normal3,_float>).z,
               auVar119._0_4_ != 0.0)))) || (NAN(auVar119._0_4_))) {
            LogFatal<char_const(&)[27]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                       ,0x51d,"Check failed: %s",(char (*) [27])"intr.IsMediumInteraction()");
          }
          pMVar94 = Interaction::AsMedium((Interaction *)local_618._0_8_);
          auVar137._4_4_ = fStack_524;
          auVar137._0_4_ = local_534[3];
          auVar137._8_4_ = fStack_520;
          auVar137._12_4_ = fStack_51c;
          auVar128._0_4_ = local_534[3] * local_598._0_4_;
          auVar128._4_4_ = fStack_524 * local_598._4_4_;
          auVar128._8_4_ = fStack_520 * local_598._8_4_;
          auVar128._12_4_ = fStack_51c * local_598._12_4_;
          auVar119 = vmovshdup_avx(auVar128);
          auVar119 = vfmadd231ss_fma(auVar119,auVar137,local_598);
          auVar137 = vfmadd132ss_fma(ZEXT416((uint)local_588._0_4_),auVar119,
                                     ZEXT416((uint)local_568._0_4_));
          auVar119._0_4_ =
               *(float *)((pMVar94->phase).super_TaggedPointer<pbrt::HGPhaseFunction>.bits &
                         0xffffffffffff);
          auVar123 = vfmadd213ss_fma(ZEXT416((uint)auVar119._0_4_),ZEXT416((uint)auVar119._0_4_),
                                     SUB6416(ZEXT464(0x3f800000),0));
          auVar121 = vfnmadd213ss_fma(ZEXT416((uint)auVar119._0_4_),ZEXT416((uint)auVar119._0_4_),
                                      SUB6416(ZEXT464(0x3f800000),0));
          auVar137 = vfmadd213ss_fma(ZEXT416((uint)(auVar119._0_4_ + auVar119._0_4_)),auVar137,
                                     auVar123);
          auVar119 = vmaxss_avx(auVar137,ZEXT416(0));
          auVar119 = vsqrtss_avx(auVar119,auVar119);
          auVar119._0_4_ = (auVar121._0_4_ * 0.07957747) / (auVar137._0_4_ * auVar119._0_4_);
          auVar119._4_12_ = SUB6012((undefined1  [60])0x0,0);
          local_278 = auVar119;
          local_378 = auVar119._0_4_;
          afStack_374[0] = auVar119._0_4_;
          afStack_374[1] = auVar119._0_4_;
          afStack_374[2] = auVar119._0_4_;
        }
        else {
          auVar174 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
          uVar222 = 0;
          SVar297 = BSDF::f((BSDF *)local_5d8,(Vector3f)pVVar102->super_Tuple3<pbrt::Vector3,_float>
                            ,wiRender,Radiance);
          auVar203._0_8_ = SVar297.values.values._8_8_;
          auVar203._8_56_ = auVar174;
          _local_478 = auVar203._0_16_;
          _local_468 = vmovshdup_avx(local_598);
          uStack_4b0 = uVar222;
          local_4b8 = (undefined1  [8])SVar297.values.values._0_8_;
          pSVar93 = Interaction::AsSurface((Interaction *)uVar177);
          auVar119._0_4_ = (pSVar93->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          auVar137 = vunpcklpd_avx(_local_4b8,_local_478);
          auVar121 = ZEXT416((uint)((float)local_588._0_4_ * auVar119._0_4_));
          auVar123 = vfmadd132ss_fma(_local_468,auVar121,
                                     ZEXT416((uint)(pSVar93->shading).n.
                                                   super_Tuple3<pbrt::Normal3,_float>.y));
          auVar119 = vfmsub213ss_fma(ZEXT416((uint)auVar119._0_4_),ZEXT416((uint)local_588._0_4_),
                                     auVar121);
          auVar119 = vfmadd231ss_fma(ZEXT416((uint)(auVar123._0_4_ + auVar119._0_4_)),local_598,
                                     ZEXT416((uint)(pSVar93->shading).n.
                                                   super_Tuple3<pbrt::Normal3,_float>.x));
          auVar127._0_4_ = auVar119._0_4_;
          auVar127._4_4_ = auVar127._0_4_;
          auVar127._8_4_ = auVar127._0_4_;
          auVar127._12_4_ = auVar127._0_4_;
          auVar8._8_4_ = 0x7fffffff;
          auVar8._0_8_ = 0x7fffffff7fffffff;
          auVar8._12_4_ = 0x7fffffff;
          auVar119 = vandps_avx512vl(auVar127,auVar8);
          local_378 = auVar119._0_4_ * auVar137._0_4_;
          afStack_374[0] = auVar119._4_4_ * auVar137._4_4_;
          afStack_374[1] = auVar119._8_4_ * auVar137._8_4_;
          afStack_374[2] = auVar119._12_4_ * auVar137._12_4_;
          local_4b8._4_4_ = afStack_374[0];
          local_4b8._0_4_ = local_378;
          uStack_4b0._0_4_ = afStack_374[1];
          uStack_4b0._4_4_ = afStack_374[2];
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = fStack_524;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = local_534[3];
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_568._0_4_;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_598._0_8_;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_588._0_4_;
          local_278._0_4_ = BSDF::PDF((BSDF *)auVar87,woRender,wiRender_00,Radiance,All);
          auVar119._0_4_ = local_4b8._0_4_;
          local_278._4_4_ = extraout_XMM0_Db_01;
          local_278._8_4_ = extraout_XMM0_Dc_01;
          local_278._12_4_ = extraout_XMM0_Dd_01;
        }
        uVar126 = 0;
        uVar173 = 0;
        uVar175 = 0;
        uVar176 = 0;
        if ((auVar119._0_4_ == 0.0) && (!NAN(auVar119._0_4_))) {
          uVar103 = 0xffffffffffffffff;
          uVar177 = 0;
          do {
            if (uVar103 == 2) goto LAB_003d0339;
            lVar109 = uVar103 + 1;
            uVar103 = uVar103 + 1;
          } while ((afStack_374[lVar109] == 0.0) && (!NAN(afStack_374[lVar109])));
          uVar222 = 0;
          if (2 < uVar103) goto LAB_003d033d;
        }
        if (local_b8 != '\0') {
          Interaction::SpawnRayTo((Ray *)&local_2b8,(Interaction *)local_618._0_8_,&local_108);
          local_4e8.values.values[2] = 1.0;
          local_4e8.values.values[0] = 1.0;
          local_4e8.values.values[1] = 1.0;
          local_4e8.values.values[3] = 1.0;
          auVar236 = ZEXT1664((undefined1  [16])local_4e8.values.values);
          pVVar116 = (VolPathIntegrator *)
                     &(pVVar116->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                      aggregate;
          local_58._8_8_ = uVar173;
          local_58._0_8_ = uVar126;
          local_58._16_8_ = uVar175;
          local_58._24_8_ = uVar176;
          local_4d0 = pVVar116;
          uVar107 = CONCAT44(fStack_2a8,IStack_2b0.high) * -0x395b586ca42e166b;
          local_458.values.values = local_4e8.values.values;
          local_4c8.values.values = local_4e8.values.values;
          uVar103 = ((((ulong)((long)local_2b8 * -0x395b586ca42e166b) >> 0x2f ^
                      (long)local_2b8 * -0x395b586ca42e166b) * -0x395b586ca42e166b ^
                     0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b ^ (ulong)(uint)IStack_2b0.low) *
                    -0x395b586ca42e166b;
          uVar105 = (uVar103 >> 0x2f ^ uVar103) * -0x395b586ca42e166b;
          uVar105 = uVar105 >> 0x2f ^ uVar105;
          uVar103 = (((uVar107 >> 0x2f ^ uVar107) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
                     -0x395b586ca42e166b ^ (ulong)(uint)fStack_2a4) * -0x395b586ca42e166b;
          uVar103 = (uVar103 >> 0x2f ^ uVar103) * -0x395b586ca42e166b;
          local_578.inc = uVar105 * 2 + 1;
          local_578.state =
               ((uVar103 >> 0x2f ^ uVar103) + 1) * 0x5851f42d4c957f2d +
               uVar105 * -0x4f5c17a566d501a4 + 1;
LAB_003cd239:
          if ((((IStack_2b0.high != 0.0) || (fStack_2a8 != 0.0)) || (fStack_2a4 != 0.0)) ||
             (NAN(fStack_2a4))) {
            *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
            local_618 = auVar236._0_16_;
            if (((ulong)(pVVar116->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                        _vptr_Integrator & 0xffffffffffff) == 0) {
              local_1a8 = ZEXT464(0) << 0x20;
              local_168 = 0;
              local_1e8 = local_1a8;
              local_228 = local_1a8;
              _local_268 = local_1a8;
LAB_003cd329:
              auVar119 = auVar295._0_16_;
              uVar256 = 0.9999;
              if ((float **)local_298.bits != (float **)0x0) {
LAB_003cd342:
                TVar89.bits = local_298.bits;
                auVar238._8_8_ = 0;
                auVar238._0_4_ = local_2b8.low;
                auVar238._4_4_ = local_2b8.high;
                auVar250._4_4_ = fStack_2a8;
                auVar250._0_4_ = IStack_2b0.high;
                auVar250._8_8_ = 0;
                auVar178._4_4_ = FStack_2a0;
                auVar178._0_4_ = fStack_2a4;
                auVar178._8_8_ = 0;
                uVar103 = local_578.state * 0x5851f42d4c957f2d + local_578.inc;
                uVar92 = (uint)(local_578.state >> 0x2d) ^ (uint)(local_578.state >> 0x1b);
                bVar95 = (byte)(local_578.state >> 0x3b);
                auVar137 = vcvtusi2ss_avx512f(in_XMM13,uVar92 >> bVar95 | uVar92 << 0x20 - bVar95);
                auVar137 = vminss_avx(ZEXT416((uint)(auVar137._0_4_ * 2.3283064e-10)),
                                      ZEXT416(0x3f7fffff));
                local_598._0_4_ = auVar137._0_4_;
                local_578.state = uVar103;
                if (0x2ffffffffffff < local_298.bits) {
                  puVar112 = (undefined8 *)(local_298.bits & 0xffffffffffff);
                  unique0x000f4700 = vmovlhps_avx(auVar250,auVar178);
                  if ((local_298.bits & 0xfffe000000000000) == 0x2000000000000) {
                    local_3d0.T_ray = &local_4c8;
                    local_3d0.lightPathPDF = &local_4e8;
                    local_3d0.uniPathPDF = &local_458;
                    local_440._0_8_ = vmovlps_avx(auVar238);
                    local_440._8_4_ = IStack_2b0.low;
                    local_420.bits = local_298.bits;
                    local_3d0.rng = &local_578;
                    auVar295 = ZEXT1664(auVar119);
                    local_62c.y = (float)uVar256;
                    Transform::ApplyInverse
                              ((Ray *)local_5c8,(Transform *)(puVar112 + 0xf),(Ray *)local_440,
                               &local_62c.y);
                    auVar296 = auVar295._4_12_;
                    auVar130._4_4_ = (float)uStack_5b8;
                    auVar130._0_4_ = fStack_5bc;
                    auVar130._8_8_ = 0;
                    auVar123 = ZEXT816(0) << 0x40;
                    bVar91 = false;
                    uVar92 = 0;
                    auVar180._0_4_ = fStack_5bc * fStack_5bc;
                    auVar180._4_4_ = (float)uStack_5b8 * (float)uStack_5b8;
                    auVar180._8_8_ = 0;
                    auVar119 = vhaddps_avx(auVar180,auVar180);
                    auVar119 = ZEXT416((uint)(auVar119._0_4_ + uStack_5b8._4_4_ * uStack_5b8._4_4_))
                    ;
                    auVar119 = vsqrtss_avx(auVar119,auVar119);
                    auVar236 = ZEXT464((uint)(auVar119._0_4_ * local_62c.y));
                    auVar240._4_4_ = auVar119._0_4_;
                    auVar240._0_4_ = auVar119._0_4_;
                    auVar240._8_4_ = auVar119._0_4_;
                    auVar240._12_4_ = auVar119._0_4_;
                    uStack_5b8._4_4_ = uStack_5b8._4_4_ / auVar119._0_4_;
                    auVar137 = vdivps_avx(auVar130,auVar240);
                    local_62c.y = auVar119._0_4_ * local_62c.y;
                    uVar177 = vmovlps_avx(auVar137);
                    fStack_5bc = (float)uVar177;
                    uStack_5b8._0_4_ = (float)((ulong)uVar177 >> 0x20);
                    auVar119 = vmovshdup_avx(auVar137);
                    fVar221 = 1.0 / auVar137._0_4_;
                    fVar248 = 1.0 / uStack_5b8._4_4_;
                    auVar119._0_4_ = 1.0 / auVar119._0_4_;
                    auVar174 = (undefined1  [56])0x0;
                    do {
                      auVar137 = ZEXT416((uint)(fVar221 *
                                               (*(float *)(puVar112 + 1) - (float)local_5c8._0_4_)))
                      ;
                      pfVar99 = (float *)((long)puVar112 + 0x14);
                      pfVar108 = (float *)local_5c8;
                      fVar237 = fVar221;
                      if (uVar92 != 0) {
                        pfVar108 = (float *)(local_5c8 + 4);
                        auVar137 = ZEXT416((uint)(auVar119._0_4_ *
                                                 (*(float *)((long)puVar112 + 0xc) -
                                                 (float)local_5c8._4_4_)));
                        pfVar99 = (float *)(puVar112 + 3);
                        fVar237 = auVar119._0_4_;
                        if (uVar92 != 1) {
                          pfVar108 = (float *)(local_5c8 + 8);
                          auVar137 = ZEXT416((uint)(fVar248 *
                                                   (*(float *)(puVar112 + 2) -
                                                   (float)local_5c8._8_4_)));
                          pfVar99 = (float *)((long)puVar112 + 0x1c);
                          fVar237 = fVar248;
                        }
                      }
                      auVar128 = ZEXT416((uint)((*pfVar99 - *pfVar108) * fVar237));
                      auVar121 = vminss_avx(auVar128,auVar137);
                      auVar137 = vmaxss_avx(auVar137,auVar128);
                      auVar123 = vmaxss_avx(auVar121,auVar123);
                      auVar137 = vminss_avx(ZEXT416((uint)(auVar137._0_4_ * 1.0000004)),
                                            auVar236._0_16_);
                      auVar236 = ZEXT1664(auVar137);
                      if (auVar137._0_4_ < auVar123._0_4_) {
                        auVar120 = local_618;
                        if (!bVar91) goto LAB_003cfc73;
                        break;
                      }
                      bVar91 = 1 < uVar92;
                      uVar92 = uVar92 + 1;
                    } while (uVar92 != 3);
                    uVar256 = *(undefined4 *)(puVar112 + 0xe);
                    local_5d8._4_4_ = uVar256;
                    local_5d8._0_4_ = uVar256;
                    uStack_5d0._0_4_ = (float)uVar256;
                    uStack_5d0._4_4_ = (float)uVar256;
                    auVar219 = ZEXT856(local_5d8._8_8_);
                    _local_4b8 = auVar123;
                    local_534[3] = auVar137._0_4_;
                    SVar297 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)(puVar112 + 4),pSVar114);
                    auVar210._0_8_ = SVar297.values.values._8_8_;
                    auVar210._8_56_ = auVar174;
                    auVar165._0_8_ = SVar297.values.values._0_8_;
                    auVar165._8_56_ = auVar219;
                    auVar119 = vmovlhps_avx(auVar165._0_16_,auVar210._0_16_);
                    local_508._4_4_ = auVar119._4_4_ * (float)local_5d8._4_4_;
                    local_508._0_4_ = auVar119._0_4_ * (float)local_5d8._0_4_;
                    fStack_500 = auVar119._8_4_ * (float)uStack_5d0;
                    fStack_4fc = auVar119._12_4_ * uStack_5d0._4_4_;
                    uVar256 = *(undefined4 *)(puVar112 + 0xe);
                    local_5d8._4_4_ = uVar256;
                    local_5d8._0_4_ = uVar256;
                    uStack_5d0._0_4_ = (float)uVar256;
                    uStack_5d0._4_4_ = (float)uVar256;
                    auVar219 = ZEXT856(local_5d8._8_8_);
                    SVar297 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)(puVar112 + 9),pSVar114);
                    pVVar116 = local_4d0;
                    pSVar114 = local_510;
                    auVar211._0_8_ = SVar297.values.values._8_8_;
                    auVar211._8_56_ = auVar174;
                    auVar166._0_8_ = SVar297.values.values._0_8_;
                    auVar166._8_56_ = auVar219;
                    auVar137 = vmovlhps_avx(auVar166._0_16_,auVar211._0_16_);
                    auVar119._0_4_ = auVar137._0_4_ * (float)local_5d8._0_4_;
                    fVar221 = auVar137._4_4_ * (float)local_5d8._4_4_;
                    fStack_490 = auVar137._8_4_ * (float)uStack_5d0;
                    fStack_48c = auVar137._12_4_ * uStack_5d0._4_4_;
                    auVar262._8_8_ = 0;
                    auVar262._0_8_ = local_5c8._0_8_;
                    auVar128 = ZEXT816(0) << 0x40;
                    lVar109 = 0;
                    local_558 = (int *)(puVar112 + 0x23);
                    local_138._0_4_ = auVar119._0_4_ + (float)local_508._0_4_;
                    local_138._4_4_ = fVar221 + (float)local_508._4_4_;
                    local_138._8_4_ = fStack_490 + fStack_500;
                    local_138._12_4_ = fStack_48c + fStack_4fc;
                    auVar236 = ZEXT1664(local_138);
                    local_498 = (int *)CONCAT44(fVar221,auVar119._0_4_);
                    auVar119._0_4_ = *(float *)(puVar112 + 2);
                    fVar237 = *(float *)((long)puVar112 + 0x1c) - auVar119._0_4_;
                    uVar177 = vcmpss_avx512f(ZEXT416((uint)auVar119._0_4_),
                                             ZEXT416((uint)*(float *)((long)puVar112 + 0x1c)),1);
                    bVar7 = (bool)((byte)uVar177 & 1);
                    auVar188._8_8_ = 0;
                    auVar188._0_8_ = *(ulong *)((long)puVar112 + 0x14);
                    auVar140._8_8_ = 0;
                    auVar140._0_8_ = puVar112[1];
                    auVar137 = vsubps_avx(auVar188,auVar140);
                    auVar123 = vsubps_avx(auVar262,auVar140);
                    uVar103 = vcmpps_avx512vl(auVar140,auVar188,1);
                    auVar141._4_4_ = (float)uStack_5b8;
                    auVar141._0_4_ = fStack_5bc;
                    auVar141._8_8_ = 0;
                    auVar121 = vdivps_avx512vl(auVar123,auVar137);
                    bVar91 = (bool)((byte)uVar103 & 1);
                    auVar124._0_4_ =
                         (float)((uint)bVar91 * auVar121._0_4_ | (uint)!bVar91 * auVar123._0_4_);
                    bVar91 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar124._4_4_ = (uint)bVar91 * auVar121._4_4_ | (uint)!bVar91 * auVar123._4_4_;
                    bVar91 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar124._8_4_ = (uint)bVar91 * auVar121._8_4_ | (uint)!bVar91 * auVar123._8_4_;
                    bVar91 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar124._12_4_ =
                         (uint)bVar91 * auVar121._12_4_ | (uint)!bVar91 * auVar123._12_4_;
                    auVar137 = vdivps_avx(auVar141,auVar137);
                    auVar123 = vmovshdup_avx(auVar124);
                    local_62c.x = uStack_5b8._4_4_ / fVar237;
                    uVar177 = vmovlps_avx(auVar137);
                    local_600.x = (float)uVar177;
                    local_600.y = SUB84(uVar177,4);
                    fVar218 = local_4b8._0_4_;
                    auVar121 = vmovshdup_avx(auVar137);
                    fVar221 = fVar218 * auVar137._0_4_ + auVar124._0_4_;
                    fVar248 = fVar218 * auVar121._0_4_ + auVar123._0_4_;
                    iVar117 = *(int *)((long)puVar112 + 0x11c);
                    iVar118 = *(int *)(puVar112 + 0x23);
                    auVar119._0_4_ =
                         (float)((uint)bVar7 *
                                 (int)(((float)local_5c8._8_4_ - auVar119._0_4_) / fVar237) +
                                (uint)!bVar7 * (int)((float)local_5c8._8_4_ - auVar119._0_4_)) +
                         fVar218 * local_62c.x;
                    fVar237 = (float)iVar117;
                    auVar263._0_4_ = (float)(iVar117 + -1);
                    auVar263._4_12_ = auVar296;
                    piVar1 = (int *)((long)puVar112 + 0x11c);
                    local_3e8._0_8_ = piVar1;
                    auVar273._0_4_ = (float)(iVar118 + -1);
                    auVar273._4_12_ = auVar296;
                    auVar137 = vminss_avx(auVar263,ZEXT416((uint)(fVar248 * fVar237)));
                    uVar177 = vcmpss_avx512f(ZEXT416((uint)(fVar248 * fVar237)),auVar128,1);
                    fVar249 = (float)iVar118;
                    iVar115 = (int)(float)((uint)!(bool)((byte)uVar177 & 1) * auVar137._0_4_);
                    auVar137 = vminss_avx(auVar273,ZEXT416((uint)(fVar221 * fVar249)));
                    uVar177 = vcmpss_avx512f(ZEXT416((uint)(fVar221 * fVar249)),auVar128,1);
                    fVar257 = (float)*(int *)(puVar112 + 0x24);
                    auVar279._0_4_ = (float)(*(int *)(puVar112 + 0x24) + -1);
                    auVar279._4_12_ = auVar296;
                    iVar101 = (int)(float)((uint)!(bool)((byte)uVar177 & 1) * auVar137._0_4_);
                    auVar137 = vminss_avx(auVar279,ZEXT416((uint)(auVar119._0_4_ * fVar257)));
                    uVar177 = vcmpss_avx512f(ZEXT416((uint)(auVar119._0_4_ * fVar257)),auVar128,1);
                    iVar104 = (int)(float)((uint)!(bool)((byte)uVar177 & 1) * auVar137._0_4_);
                    do {
                      iVar106 = (int)lVar109;
                      if (iVar106 == 1) {
                        local_5f0[1] = iVar115;
                        piVar110 = local_54c + 1;
                        piVar111 = local_54c + 4;
                        pfVar99 = local_534 + 1;
                        pfVar108 = local_5e4 + 1;
                        pTVar113 = (Tuple3<pbrt::Point3,_float> *)&local_600.y;
                        iVar97 = iVar115;
                      }
                      else if (iVar106 == 0) {
                        local_5f0[lVar109] = iVar101;
                        piVar110 = local_54c;
                        piVar111 = local_54c + 3;
                        pfVar99 = local_534;
                        pfVar108 = local_5e4;
                        pTVar113 = &local_600;
                        iVar97 = iVar101;
                      }
                      else {
                        piVar110 = local_54c + 2;
                        piVar111 = local_54c + 5;
                        pfVar99 = local_534 + 2;
                        pfVar108 = local_5e4 + 2;
                        pTVar113 = &local_62c;
                        local_5f0[lVar109] = iVar104;
                        iVar97 = iVar104;
                      }
                      if ((pTVar113->x == 0.0) && (!NAN(pTVar113->x))) {
                        pTVar113 = &local_600;
                        if ((iVar106 != 0) &&
                           (pTVar113 = (Tuple3<pbrt::Point3,_float> *)&local_600.y, iVar106 != 1)) {
                          pTVar113 = &local_62c;
                        }
                        pTVar113->x = 0.0;
                      }
                      pTVar113 = &local_600;
                      if ((iVar106 != 0) &&
                         (pTVar113 = (Tuple3<pbrt::Point3,_float> *)&local_600.y, iVar106 != 1)) {
                        pTVar113 = &local_62c;
                      }
                      if (0.0 <= pTVar113->x) {
                        fVar270 = (float)(iVar97 + 1);
                        if (iVar106 == 1) {
                          *pfVar108 = fVar218 + (fVar270 / fVar237 - fVar248) / local_600.y;
                          fVar270 = local_600.y * fVar237;
                          piVar98 = piVar1;
                        }
                        else if (iVar106 == 0) {
                          *pfVar108 = fVar218 + (fVar270 / fVar249 - fVar221) / local_600.x;
                          fVar270 = local_600.x * fVar249;
                          piVar98 = local_558;
                        }
                        else {
                          *pfVar108 = fVar218 + (fVar270 / fVar257 - auVar119._0_4_) / local_62c.x;
                          fVar270 = local_62c.x * fVar257;
                          piVar98 = (int *)(puVar112 + 0x24);
                        }
                        *piVar111 = 1;
                        *pfVar99 = 1.0 / fVar270;
                        iVar106 = *piVar98;
                      }
                      else {
                        fVar270 = (float)iVar97;
                        if (iVar106 == 1) {
                          fVar270 = fVar270 / fVar237 - fVar248;
                          piVar98 = piVar1;
                          fVar220 = local_600.y;
                        }
                        else if (iVar106 == 0) {
                          fVar270 = fVar270 / fVar249 - fVar221;
                          piVar98 = local_558;
                          fVar220 = local_600.x;
                        }
                        else {
                          fVar270 = fVar270 / fVar257 - auVar119._0_4_;
                          piVar98 = (int *)(puVar112 + 0x24);
                          fVar220 = local_62c.x;
                        }
                        *pfVar108 = fVar218 + fVar270 / fVar220;
                        iVar97 = *piVar98;
                        iVar106 = -1;
                        *piVar111 = -1;
                        *pfVar99 = -1.0 / (fVar220 * (float)iVar97);
                      }
                      lVar109 = lVar109 + 1;
                      *piVar110 = iVar106;
                    } while (lVar109 != 3);
                    auVar269 = ZEXT464((uint)local_598._0_4_);
                    auVar283 = ZEXT464((uint)local_534[3]);
                    auVar137 = _local_4b8;
                    auVar120 = local_618;
                    while( true ) {
                      auVar292 = ZEXT1664(auVar137);
                      lVar109 = (long)*(int *)(&DAT_0286b0a0 +
                                              (ulong)((uint)(local_5e4[1] < local_5e4[2]) |
                                                     (uint)(local_5e4[0] < local_5e4[1]) * 4 +
                                                     (uint)(local_5e4[0] < local_5e4[2]) * 2) * 4);
                      auVar119._0_4_ = local_5e4[lVar109];
                      auVar123 = vminss_avx(ZEXT416((uint)auVar119._0_4_),auVar283._0_16_);
                      auVar295 = ZEXT1664(auVar123);
                      uVar256 = *(undefined4 *)
                                 (puVar112[0x20] +
                                 ((long)((iVar117 * local_5f0[2] + local_5f0[1]) * iVar118) +
                                 (long)local_5f0[0]) * 4);
                      auVar47._4_4_ = uVar256;
                      auVar47._0_4_ = uVar256;
                      auVar47._8_4_ = uVar256;
                      auVar47._12_4_ = uVar256;
                      auVar121 = vmulps_avx512vl(auVar236._0_16_,auVar47);
                      fVar221 = auVar121._0_4_;
                      if ((fVar221 != 0.0) || (NAN(fVar221))) {
                        local_418 = -fVar221;
                        fStack_414 = -auVar121._4_4_;
                        fStack_410 = -auVar121._8_4_;
                        fStack_40c = -auVar121._12_4_;
                        local_568._0_4_ = auVar123._0_4_;
                        _local_5d8 = auVar120;
                        _local_588 = auVar121;
                        local_3ac = auVar119._0_4_;
                        while( true ) {
                          local_598._0_4_ = auVar292._0_4_;
                          auVar119._0_4_ = logf(1.0 - auVar269._0_4_);
                          uVar88 = local_578.state;
                          auVar295 = ZEXT464((uint)local_568._0_4_);
                          uVar103 = local_578.state >> 0x1b;
                          local_578.state = local_578.state * 0x5851f42d4c957f2d + local_578.inc;
                          uVar92 = (uint)(uVar88 >> 0x2d) ^ (uint)uVar103;
                          bVar95 = (byte)(uVar88 >> 0x3b);
                          auVar119._0_4_ =
                               (float)local_598._0_4_ - auVar119._0_4_ / (float)local_588._0_4_;
                          auVar292 = ZEXT464((uint)auVar119._0_4_);
                          auVar137 = vcvtusi2ss_avx512f(in_XMM13,uVar92 >> bVar95 |
                                                                 uVar92 << 0x20 - bVar95);
                          auVar137 = vminss_avx(ZEXT416((uint)(auVar137._0_4_ * 2.3283064e-10)),
                                                ZEXT416(0x3f7fffff));
                          auVar269 = ZEXT1664(auVar137);
                          if ((float)local_568._0_4_ <= auVar119._0_4_) break;
                          if (auVar119._0_4_ < local_534[3]) {
                            fVar221 = auVar119._0_4_ - (float)local_598._0_4_;
                            auVar229._8_4_ = 0x3da00ac9;
                            auVar229._0_8_ = 0x3da00ac93da00ac9;
                            auVar229._12_4_ = 0x3da00ac9;
                            auVar244._8_4_ = 0xffffff81;
                            auVar244._0_8_ = 0xffffff81ffffff81;
                            auVar244._12_4_ = 0xffffff81;
                            local_598._0_4_ = auVar137._0_4_;
                            _local_4b8 = ZEXT416((uint)auVar119._0_4_);
                            auVar143._0_4_ = fVar221 * local_418;
                            auVar143._4_4_ = fVar221 * fStack_414;
                            auVar143._8_4_ = fVar221 * fStack_410;
                            auVar143._12_4_ = fVar221 * fStack_40c;
                            auVar54._8_4_ = 0x3fb8aa3b;
                            auVar54._0_8_ = 0x3fb8aa3b3fb8aa3b;
                            auVar54._12_4_ = 0x3fb8aa3b;
                            auVar123 = vmulps_avx512vl(auVar143,auVar54);
                            auVar137 = vroundps_avx(auVar123,9);
                            auVar123 = vsubps_avx(auVar123,auVar137);
                            auVar55._8_4_ = 0x3e679a0b;
                            auVar55._0_8_ = 0x3e679a0b3e679a0b;
                            auVar55._12_4_ = 0x3e679a0b;
                            auVar121 = vfmadd213ps_avx512vl(auVar229,auVar123,auVar55);
                            auVar190._0_4_ = (int)auVar137._0_4_;
                            auVar190._4_4_ = (int)auVar137._4_4_;
                            auVar190._8_4_ = (int)auVar137._8_4_;
                            auVar190._12_4_ = (int)auVar137._12_4_;
                            auVar137 = vpaddd_avx(auVar190,auVar244);
                            auVar56._8_4_ = 0x3f321004;
                            auVar56._0_8_ = 0x3f3210043f321004;
                            auVar56._12_4_ = 0x3f321004;
                            auVar121 = vfmadd213ps_avx512vl(auVar121,auVar123,auVar56);
                            auVar123 = vfmadd213ps_fma(auVar121,auVar123,local_618);
                            auVar121 = vpsrld_avx(auVar123,0x17);
                            auVar137 = vpaddd_avx(auVar137,auVar121);
                            auVar57._8_4_ = 0x807fffff;
                            auVar57._0_8_ = 0x807fffff807fffff;
                            auVar57._12_4_ = 0x807fffff;
                            auVar123 = vpandd_avx512vl(auVar123,auVar57);
                            auVar58._8_4_ = 0x7f;
                            auVar58._0_8_ = 0x7f0000007f;
                            auVar58._12_4_ = 0x7f;
                            uVar103 = vpcmpgtd_avx512vl(auVar137,auVar58);
                            uVar103 = uVar103 & 0xf;
                            uVar105 = vpcmpgtd_avx512vl(auVar137,auVar244);
                            uVar105 = uVar105 & 0xf;
                            auVar137 = vpslld_avx(auVar137,0x17);
                            auVar59._8_4_ = 0x3f800000;
                            auVar59._0_8_ = 0x3f8000003f800000;
                            auVar59._12_4_ = 0x3f800000;
                            auVar137 = vpaddd_avx512vl(auVar137,auVar59);
                            auVar137 = vpord_avx512vl(auVar137,auVar123);
                            auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                            bVar91 = (bool)((byte)uVar103 & 1);
                            bVar7 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar5 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar6 = SUB81(uVar103 >> 3,0);
                            local_468._4_4_ =
                                 (uint)bVar7 * auVar123._4_4_ |
                                 (uint)!bVar7 * (uint)((byte)(uVar105 >> 1) & 1) * auVar137._4_4_;
                            local_468._0_4_ =
                                 (uint)bVar91 * auVar123._0_4_ |
                                 (uint)!bVar91 * (uint)((byte)uVar105 & 1) * auVar137._0_4_;
                            fStack_460 = (float)((uint)bVar5 * auVar123._8_4_ |
                                                (uint)!bVar5 *
                                                (uint)((byte)(uVar105 >> 2) & 1) * auVar137._8_4_);
                            fStack_45c = (float)((uint)bVar6 * auVar123._12_4_ |
                                                (uint)!bVar6 *
                                                (uint)(byte)(uVar105 >> 3) * auVar137._12_4_);
                            fVar221 = auVar119._0_4_ * fStack_5bc + (float)local_5c8._0_8_;
                            fVar248 = auVar119._0_4_ * (float)uStack_5b8 + SUB84(local_5c8._0_8_,4);
                            _local_488 = CONCAT412(auVar119._0_4_ * 0.0 + 0.0,
                                                   CONCAT48(auVar119._0_4_ * 0.0 + 0.0,
                                                            CONCAT44(fVar248,fVar221)));
                            _local_478 = vmovshdup_avx(_local_488);
                            auVar119._0_4_ =
                                 auVar119._0_4_ * uStack_5b8._4_4_ + (float)local_5c8._8_4_;
                            local_4f8._0_4_ = auVar119._0_4_;
                            PVar298.super_Tuple3<pbrt::Point3,_float>.z = auVar119._0_4_;
                            PVar298.super_Tuple3<pbrt::Point3,_float>.x = fVar221;
                            PVar298.super_Tuple3<pbrt::Point3,_float>.y = fVar248;
                            auVar219 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                            auVar174 = ZEXT856(local_488._8_8_);
                            SVar297 = CloudMediumProvider::Density
                                                ((CloudMediumProvider *)*puVar112,PVar298,pSVar114);
                            auVar212._0_8_ = SVar297.values.values._8_8_;
                            auVar212._8_56_ = auVar219;
                            auVar167._0_8_ = SVar297.values.values._0_8_;
                            auVar167._8_56_ = auVar174;
                            auVar137 = vmovlhps_avx(auVar167._0_16_,auVar212._0_16_);
                            local_2f8.values.values[0] = auVar137._0_4_ * (float)local_498;
                            local_2f8.values.values[1] = auVar137._4_4_ * local_498._4_4_;
                            local_2f8.values.values[2] = auVar137._8_4_ * fStack_490;
                            local_2f8.values.values[3] = auVar137._12_4_ * fStack_48c;
                            auVar119 = vfmadd231ss_fma(ZEXT416((uint)((float)local_478._0_4_ *
                                                                     *(float *)((long)puVar112 +
                                                                               0x7c))),_local_488,
                                                       ZEXT416(*(uint *)(puVar112 + 0xf)));
                            auVar123 = vfmadd231ss_fma(ZEXT416((uint)((float)local_478._0_4_ *
                                                                     *(float *)((long)puVar112 +
                                                                               0x8c))),_local_488,
                                                       ZEXT416(*(uint *)(puVar112 + 0x11)));
                            auVar121 = vfmadd231ss_fma(ZEXT416((uint)((float)local_478._0_4_ *
                                                                     *(float *)((long)puVar112 +
                                                                               0x9c))),_local_488,
                                                       ZEXT416(*(uint *)(puVar112 + 0x13)));
                            auVar119 = vfmadd231ss_fma(auVar119,ZEXT416((uint)local_4f8._0_4_),
                                                       ZEXT416(*(uint *)(puVar112 + 0x10)));
                            auVar123 = vfmadd231ss_fma(auVar123,ZEXT416((uint)local_4f8._0_4_),
                                                       ZEXT416(*(uint *)(puVar112 + 0x12)));
                            auVar121 = vfmadd231ss_fma(auVar121,ZEXT416((uint)local_4f8._0_4_),
                                                       ZEXT416(*(uint *)(puVar112 + 0x14)));
                            auVar128 = vfmadd231ss_fma(ZEXT416((uint)((float)local_478._0_4_ *
                                                                     *(float *)((long)puVar112 +
                                                                               0xac))),_local_488,
                                                       ZEXT416(*(uint *)(puVar112 + 0x15)));
                            auVar119._0_4_ = auVar119._0_4_ + *(float *)((long)puVar112 + 0x84);
                            fVar221 = auVar123._0_4_ + *(float *)((long)puVar112 + 0x94);
                            fVar248 = auVar121._0_4_ + *(float *)((long)puVar112 + 0xa4);
                            auVar123 = vfmadd231ss_fma(auVar128,ZEXT416((uint)local_4f8._0_4_),
                                                       ZEXT416(*(uint *)(puVar112 + 0x16)));
                            fVar237 = auVar123._0_4_ + *(float *)((long)puVar112 + 0xb4);
                            bVar91 = fVar237 == 1.0;
                            iVar117 = (uint)bVar91 * (int)fVar248 +
                                      (uint)!bVar91 * (int)(fVar248 / fVar237);
                            iVar118 = (uint)bVar91 * (int)auVar119._0_4_ +
                                      (uint)!bVar91 * (int)(auVar119._0_4_ / fVar237);
                            iVar101 = (uint)bVar91 * (int)fVar221 +
                                      (uint)!bVar91 * (int)(fVar221 / fVar237);
                            auVar280._4_4_ = iVar118;
                            auVar280._0_4_ = iVar118;
                            auVar280._8_4_ = iVar118;
                            auVar280._12_4_ = iVar118;
                            auVar285._4_4_ = iVar101;
                            auVar285._0_4_ = iVar101;
                            auVar285._8_4_ = iVar101;
                            auVar285._12_4_ = iVar101;
                            auVar274._4_4_ = iVar117;
                            auVar274._0_4_ = iVar117;
                            auVar274._8_4_ = iVar117;
                            auVar274._12_4_ = iVar117;
                            auVar123 = vmovlhps_avx(auVar280,auVar285);
                            local_338 = ZEXT416(0) << 0x20;
                            auVar289._0_4_ = local_440._12_4_ * local_440._12_4_;
                            auVar289._4_4_ = local_440._16_4_ * local_440._16_4_;
                            auVar289._8_8_ = 0;
                            auVar264._0_8_ = local_440._12_8_ ^ 0x8000000080000000;
                            auVar264._8_4_ = 0x80000000;
                            auVar264._12_4_ = 0x80000000;
                            auVar119 = vhaddps_avx(auVar289,auVar289);
                            auVar119 = ZEXT416((uint)(auVar119._0_4_ + fStack_42c * fStack_42c));
                            auVar119 = vsqrtss_avx(auVar119,auVar119);
                            fStack_33c = auVar119._0_4_;
                            auVar290._4_4_ = fStack_33c;
                            auVar290._0_4_ = fStack_33c;
                            auVar290._8_4_ = fStack_33c;
                            auVar290._12_4_ = fStack_33c;
                            fStack_33c = -fStack_42c / fStack_33c;
                            auVar119 = vdivps_avx(auVar264,auVar290);
                            local_328 = 0.0;
                            local_360._0_8_ = auVar123._0_8_;
                            local_360._8_4_ = auVar123._8_4_;
                            local_360._12_4_ = auVar123._12_4_;
                            local_360._16_8_ = vmovlps_avx(auVar274);
                            local_360._24_4_ = FStack_428;
                            uVar177 = vmovlps_avx(auVar119);
                            fStack_344 = (float)uVar177;
                            fStack_340 = (float)((ulong)uVar177 >> 0x20);
                            local_320 = (MediumInterface *)0x0;
                            local_308.values.values[1] = auVar137._4_4_ * (float)local_508._4_4_;
                            local_308.values.values[0] = auVar137._0_4_ * (float)local_508._0_4_;
                            local_308.values.values[2] = auVar137._8_4_ * fStack_500;
                            local_308.values.values[3] = auVar137._12_4_ * fStack_4fc;
                            local_2e8._16_16_ = local_338;
                            local_2e8._0_16_ = _local_588;
                            local_2c8.values.values[1] =
                                 (float)local_468._4_4_ * (float)local_5d8._4_4_;
                            local_2c8.values.values[0] =
                                 (float)local_468._0_4_ * (float)local_5d8._0_4_;
                            local_2c8.values.values[2] = fStack_460 * (float)uStack_5d0;
                            local_2c8.values.values[3] = fStack_45c * uStack_5d0._4_4_;
                            local_318.bits = TVar89.bits | 0x3000000000000;
                            local_310.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                                 (TaggedPointer<pbrt::HGPhaseFunction>)
                                 (TaggedPointer<pbrt::HGPhaseFunction>)
                                 ((long)puVar112 + 0x74U | 0x1000000000000);
                            bVar91 = SampleLd::anon_class_32_4_3820c045::operator()
                                               (&local_3d0,(MediumSample *)local_360);
                            auVar292 = ZEXT1664(_local_4b8);
                            auVar269 = ZEXT464((uint)local_598._0_4_);
                            _local_5d8 = local_618;
                            if (!bVar91) goto LAB_003cf15b;
                          }
                        }
                        auVar119._0_4_ = (float)local_568._0_4_ - (float)local_598._0_4_;
                        auVar230._8_4_ = 0x3da00ac9;
                        auVar230._0_8_ = 0x3da00ac93da00ac9;
                        auVar230._12_4_ = 0x3da00ac9;
                        auVar245._8_4_ = 0xffffff81;
                        auVar245._0_8_ = 0xffffff81ffffff81;
                        auVar245._12_4_ = 0xffffff81;
                        auVar283 = ZEXT464((uint)local_534[3]);
                        auVar236 = ZEXT1664(local_138);
                        auVar144._0_4_ = auVar119._0_4_ * local_418;
                        auVar144._4_4_ = auVar119._0_4_ * fStack_414;
                        auVar144._8_4_ = auVar119._0_4_ * fStack_410;
                        auVar144._12_4_ = auVar119._0_4_ * fStack_40c;
                        auVar60._8_4_ = 0x3fb8aa3b;
                        auVar60._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar60._12_4_ = 0x3fb8aa3b;
                        auVar137 = vmulps_avx512vl(auVar144,auVar60);
                        auVar119 = vroundps_avx(auVar137,9);
                        auVar137 = vsubps_avx(auVar137,auVar119);
                        auVar61._8_4_ = 0x3e679a0b;
                        auVar61._0_8_ = 0x3e679a0b3e679a0b;
                        auVar61._12_4_ = 0x3e679a0b;
                        auVar123 = vfmadd213ps_avx512vl(auVar230,auVar137,auVar61);
                        auVar191._0_4_ = (int)auVar119._0_4_;
                        auVar191._4_4_ = (int)auVar119._4_4_;
                        auVar191._8_4_ = (int)auVar119._8_4_;
                        auVar191._12_4_ = (int)auVar119._12_4_;
                        auVar119 = vpaddd_avx(auVar191,auVar245);
                        auVar62._8_4_ = 0x3f321004;
                        auVar62._0_8_ = 0x3f3210043f321004;
                        auVar62._12_4_ = 0x3f321004;
                        auVar123 = vfmadd213ps_avx512vl(auVar123,auVar137,auVar62);
                        auVar137 = vfmadd213ps_fma(auVar123,auVar137,local_618);
                        auVar123 = vpsrld_avx(auVar137,0x17);
                        auVar119 = vpaddd_avx(auVar119,auVar123);
                        auVar63._8_4_ = 0x7f;
                        auVar63._0_8_ = 0x7f0000007f;
                        auVar63._12_4_ = 0x7f;
                        uVar105 = vpcmpgtd_avx512vl(auVar119,auVar63);
                        auVar64._8_4_ = 0x807fffff;
                        auVar64._0_8_ = 0x807fffff807fffff;
                        auVar64._12_4_ = 0x807fffff;
                        auVar121 = vpandd_avx512vl(auVar137,auVar64);
                        uVar103 = vpcmpgtd_avx512vl(auVar119,auVar245);
                        auVar119 = vpslld_avx(auVar119,0x17);
                        auVar65._8_4_ = 0x3f800000;
                        auVar65._0_8_ = 0x3f8000003f800000;
                        auVar65._12_4_ = 0x3f800000;
                        auVar123 = vpaddd_avx512vl(auVar119,auVar65);
                        auVar119._0_4_ = local_3ac;
                        auVar137 = _local_5d8;
                      }
                      else {
                        fVar248 = auVar123._0_4_ - auVar137._0_4_;
                        auVar228._8_4_ = 0x3da00ac9;
                        auVar228._0_8_ = 0x3da00ac93da00ac9;
                        auVar228._12_4_ = 0x3da00ac9;
                        auVar252._8_4_ = 0xffffff81;
                        auVar252._0_8_ = 0xffffff81ffffff81;
                        auVar252._12_4_ = 0xffffff81;
                        auVar142._0_4_ = fVar248 * -fVar221;
                        auVar142._4_4_ = fVar248 * -auVar121._4_4_;
                        auVar142._8_4_ = fVar248 * -auVar121._8_4_;
                        auVar142._12_4_ = fVar248 * -auVar121._12_4_;
                        auVar48._8_4_ = 0x3fb8aa3b;
                        auVar48._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar48._12_4_ = 0x3fb8aa3b;
                        auVar123 = vmulps_avx512vl(auVar142,auVar48);
                        auVar137 = vroundps_avx(auVar123,9);
                        auVar123 = vsubps_avx(auVar123,auVar137);
                        auVar49._8_4_ = 0x3e679a0b;
                        auVar49._0_8_ = 0x3e679a0b3e679a0b;
                        auVar49._12_4_ = 0x3e679a0b;
                        auVar121 = vfmadd213ps_avx512vl(auVar228,auVar123,auVar49);
                        auVar189._0_4_ = (int)auVar137._0_4_;
                        auVar189._4_4_ = (int)auVar137._4_4_;
                        auVar189._8_4_ = (int)auVar137._8_4_;
                        auVar189._12_4_ = (int)auVar137._12_4_;
                        auVar137 = vpaddd_avx(auVar189,auVar252);
                        auVar50._8_4_ = 0x3f321004;
                        auVar50._0_8_ = 0x3f3210043f321004;
                        auVar50._12_4_ = 0x3f321004;
                        auVar121 = vfmadd213ps_avx512vl(auVar121,auVar123,auVar50);
                        auVar123 = vfmadd213ps_fma(auVar121,auVar123,local_618);
                        auVar121 = vpsrld_avx(auVar123,0x17);
                        auVar137 = vpaddd_avx(auVar137,auVar121);
                        auVar51._8_4_ = 0x7f;
                        auVar51._0_8_ = 0x7f0000007f;
                        auVar51._12_4_ = 0x7f;
                        uVar105 = vpcmpgtd_avx512vl(auVar137,auVar51);
                        auVar52._8_4_ = 0x807fffff;
                        auVar52._0_8_ = 0x807fffff807fffff;
                        auVar52._12_4_ = 0x807fffff;
                        auVar121 = vpandd_avx512vl(auVar123,auVar52);
                        uVar103 = vpcmpgtd_avx512vl(auVar137,auVar252);
                        auVar137 = vpslld_avx(auVar137,0x17);
                        auVar53._8_4_ = 0x3f800000;
                        auVar53._0_8_ = 0x3f8000003f800000;
                        auVar53._12_4_ = 0x3f800000;
                        auVar123 = vpaddd_avx512vl(auVar137,auVar53);
                        auVar137 = auVar120;
                      }
                      uVar105 = uVar105 & 0xf;
                      uVar103 = uVar103 & 0xf;
                      auVar123 = vpord_avx512vl(auVar123,auVar121);
                      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                      bVar91 = (bool)((byte)uVar105 & 1);
                      bVar7 = (bool)((byte)(uVar105 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar105 >> 2) & 1);
                      bVar6 = SUB81(uVar105 >> 3,0);
                      auVar120._0_4_ =
                           (float)((uint)bVar91 * auVar121._0_4_ |
                                  (uint)!bVar91 * (uint)((byte)uVar103 & 1) * auVar123._0_4_) *
                           auVar137._0_4_;
                      auVar120._4_4_ =
                           (float)((uint)bVar7 * auVar121._4_4_ |
                                  (uint)!bVar7 * (uint)((byte)(uVar103 >> 1) & 1) * auVar123._4_4_)
                           * auVar137._4_4_;
                      auVar120._8_4_ =
                           (float)((uint)bVar5 * auVar121._8_4_ |
                                  (uint)!bVar5 * (uint)((byte)(uVar103 >> 2) & 1) * auVar123._8_4_)
                           * auVar137._8_4_;
                      auVar120._12_4_ =
                           (float)((uint)bVar6 * auVar121._12_4_ |
                                  (uint)!bVar6 * (uint)(byte)(uVar103 >> 3) * auVar123._12_4_) *
                           auVar137._12_4_;
                      if ((auVar283._0_4_ < auVar119._0_4_) ||
                         (iVar117 = local_5f0[lVar109], iVar118 = local_54c[lVar109 + 3],
                         local_5f0[lVar109] = iVar117 + iVar118, piVar1 = local_558,
                         iVar117 + iVar118 == local_54c[lVar109])) break;
                      uVar177 = local_3e8._0_8_;
                      auVar137 = auVar295._0_16_;
                      local_5e4[lVar109] = auVar119._0_4_ + local_534[lVar109];
                      iVar118 = *piVar1;
                      iVar117 = *(int *)uVar177;
                    }
                  }
                  else {
                    local_3d0.T_ray = &local_4c8;
                    local_3d0.lightPathPDF = &local_4e8;
                    local_3d0.uniPathPDF = &local_458;
                    local_440._0_8_ = vmovlps_avx(auVar238);
                    local_440._8_4_ = IStack_2b0.low;
                    local_420.bits = local_298.bits;
                    local_3d0.rng = &local_578;
                    auVar295 = ZEXT1664(auVar119);
                    local_62c.x = (float)uVar256;
                    Transform::ApplyInverse
                              ((Ray *)local_5c8,(Transform *)(puVar112 + 0xf),(Ray *)local_440,
                               &local_62c.x);
                    auVar296 = auVar295._4_12_;
                    auVar133._4_4_ = (float)uStack_5b8;
                    auVar133._0_4_ = fStack_5bc;
                    auVar133._8_8_ = 0;
                    auVar123 = ZEXT816(0) << 0x40;
                    bVar91 = false;
                    uVar92 = 0;
                    auVar182._0_4_ = fStack_5bc * fStack_5bc;
                    auVar182._4_4_ = (float)uStack_5b8 * (float)uStack_5b8;
                    auVar182._8_8_ = 0;
                    auVar119 = vhaddps_avx(auVar182,auVar182);
                    auVar119 = ZEXT416((uint)(auVar119._0_4_ + uStack_5b8._4_4_ * uStack_5b8._4_4_))
                    ;
                    auVar119 = vsqrtss_avx(auVar119,auVar119);
                    auVar236 = ZEXT464((uint)(auVar119._0_4_ * local_62c.x));
                    auVar241._4_4_ = auVar119._0_4_;
                    auVar241._0_4_ = auVar119._0_4_;
                    auVar241._8_4_ = auVar119._0_4_;
                    auVar241._12_4_ = auVar119._0_4_;
                    uStack_5b8._4_4_ = uStack_5b8._4_4_ / auVar119._0_4_;
                    auVar137 = vdivps_avx(auVar133,auVar241);
                    local_62c.x = auVar119._0_4_ * local_62c.x;
                    uVar177 = vmovlps_avx(auVar137);
                    fStack_5bc = (float)uVar177;
                    uStack_5b8._0_4_ = (float)((ulong)uVar177 >> 0x20);
                    auVar119 = vmovshdup_avx(auVar137);
                    fVar221 = 1.0 / auVar137._0_4_;
                    fVar248 = 1.0 / uStack_5b8._4_4_;
                    auVar119._0_4_ = 1.0 / auVar119._0_4_;
                    auVar174 = (undefined1  [56])0x0;
                    do {
                      auVar137 = ZEXT416((uint)(fVar221 *
                                               (*(float *)(puVar112 + 1) - (float)local_5c8._0_4_)))
                      ;
                      pfVar99 = (float *)((long)puVar112 + 0x14);
                      pfVar108 = (float *)local_5c8;
                      fVar237 = fVar221;
                      if (uVar92 != 0) {
                        pfVar108 = (float *)(local_5c8 + 4);
                        auVar137 = ZEXT416((uint)(auVar119._0_4_ *
                                                 (*(float *)((long)puVar112 + 0xc) -
                                                 (float)local_5c8._4_4_)));
                        pfVar99 = (float *)(puVar112 + 3);
                        fVar237 = auVar119._0_4_;
                        if (uVar92 != 1) {
                          pfVar108 = (float *)(local_5c8 + 8);
                          auVar137 = ZEXT416((uint)(fVar248 *
                                                   (*(float *)(puVar112 + 2) -
                                                   (float)local_5c8._8_4_)));
                          pfVar99 = (float *)((long)puVar112 + 0x1c);
                          fVar237 = fVar248;
                        }
                      }
                      auVar128 = ZEXT416((uint)((*pfVar99 - *pfVar108) * fVar237));
                      auVar121 = vminss_avx(auVar128,auVar137);
                      auVar137 = vmaxss_avx(auVar137,auVar128);
                      auVar123 = vmaxss_avx(auVar121,auVar123);
                      auVar137 = vminss_avx(ZEXT416((uint)(auVar137._0_4_ * 1.0000004)),
                                            auVar236._0_16_);
                      auVar236 = ZEXT1664(auVar137);
                      if (auVar137._0_4_ < auVar123._0_4_) {
                        auVar120 = local_618;
                        if (!bVar91) goto LAB_003cfc73;
                        break;
                      }
                      bVar91 = 1 < uVar92;
                      uVar92 = uVar92 + 1;
                    } while (uVar92 != 3);
                    uVar256 = *(undefined4 *)(puVar112 + 0xe);
                    local_5d8._4_4_ = uVar256;
                    local_5d8._0_4_ = uVar256;
                    uStack_5d0._0_4_ = (float)uVar256;
                    uStack_5d0._4_4_ = (float)uVar256;
                    auVar219 = ZEXT856(local_5d8._8_8_);
                    local_4b8._0_4_ = auVar137._0_4_;
                    _local_588 = auVar123;
                    SVar297 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)(puVar112 + 4),pSVar114);
                    auVar213._0_8_ = SVar297.values.values._8_8_;
                    auVar213._8_56_ = auVar174;
                    auVar168._0_8_ = SVar297.values.values._0_8_;
                    auVar168._8_56_ = auVar219;
                    auVar119 = vmovlhps_avx(auVar168._0_16_,auVar213._0_16_);
                    local_488._4_4_ = auVar119._4_4_ * (float)local_5d8._4_4_;
                    local_488._0_4_ = auVar119._0_4_ * (float)local_5d8._0_4_;
                    fStack_480 = auVar119._8_4_ * (float)uStack_5d0;
                    fStack_47c = auVar119._12_4_ * uStack_5d0._4_4_;
                    uVar256 = *(undefined4 *)(puVar112 + 0xe);
                    local_5d8._4_4_ = uVar256;
                    local_5d8._0_4_ = uVar256;
                    uStack_5d0._0_4_ = (float)uVar256;
                    uStack_5d0._4_4_ = (float)uVar256;
                    auVar219 = ZEXT856(local_5d8._8_8_);
                    SVar297 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)(puVar112 + 9),pSVar114);
                    auVar214._0_8_ = SVar297.values.values._8_8_;
                    auVar214._8_56_ = auVar174;
                    auVar169._0_8_ = SVar297.values.values._0_8_;
                    auVar169._8_56_ = auVar219;
                    auVar119 = vmovlhps_avx(auVar169._0_16_,auVar214._0_16_);
                    local_418 = auVar119._0_4_ * (float)local_5d8._0_4_;
                    fStack_414 = auVar119._4_4_ * (float)local_5d8._4_4_;
                    fStack_410 = auVar119._8_4_ * (float)uStack_5d0;
                    fStack_40c = auVar119._12_4_ * uStack_5d0._4_4_;
                    auVar265._8_8_ = 0;
                    auVar265._0_8_ = local_5c8._0_8_;
                    piVar1 = (int *)(puVar112 + 0x23);
                    auVar128 = ZEXT816(0) << 0x40;
                    local_498 = (int *)((long)puVar112 + 0x11c);
                    lVar109 = 0;
                    local_508 = (undefined1  [8])piVar1;
                    local_3e8._0_4_ = local_418 + (float)local_488._0_4_;
                    local_3e8._4_4_ = fStack_414 + (float)local_488._4_4_;
                    local_3e8._8_4_ = fStack_410 + fStack_480;
                    local_3e8._12_4_ = fStack_40c + fStack_47c;
                    auVar236 = ZEXT1664(local_3e8);
                    auVar119._0_4_ = *(float *)(puVar112 + 2);
                    fVar237 = *(float *)((long)puVar112 + 0x1c) - auVar119._0_4_;
                    uVar177 = vcmpss_avx512f(ZEXT416((uint)auVar119._0_4_),
                                             ZEXT416((uint)*(float *)((long)puVar112 + 0x1c)),1);
                    bVar7 = (bool)((byte)uVar177 & 1);
                    auVar192._8_8_ = 0;
                    auVar192._0_8_ = *(ulong *)((long)puVar112 + 0x14);
                    auVar145._8_8_ = 0;
                    auVar145._0_8_ = puVar112[1];
                    auVar137 = vsubps_avx(auVar192,auVar145);
                    auVar123 = vsubps_avx(auVar265,auVar145);
                    uVar103 = vcmpps_avx512vl(auVar145,auVar192,1);
                    auVar146._4_4_ = (float)uStack_5b8;
                    auVar146._0_4_ = fStack_5bc;
                    auVar146._8_8_ = 0;
                    auVar121 = vdivps_avx512vl(auVar123,auVar137);
                    bVar91 = (bool)((byte)uVar103 & 1);
                    auVar125._0_4_ =
                         (float)((uint)bVar91 * auVar121._0_4_ | (uint)!bVar91 * auVar123._0_4_);
                    bVar91 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar125._4_4_ = (uint)bVar91 * auVar121._4_4_ | (uint)!bVar91 * auVar123._4_4_;
                    bVar91 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar125._8_4_ = (uint)bVar91 * auVar121._8_4_ | (uint)!bVar91 * auVar123._8_4_;
                    bVar91 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar125._12_4_ =
                         (uint)bVar91 * auVar121._12_4_ | (uint)!bVar91 * auVar123._12_4_;
                    auVar137 = vdivps_avx(auVar146,auVar137);
                    auVar123 = vmovshdup_avx(auVar125);
                    local_61c = uStack_5b8._4_4_ / fVar237;
                    uVar177 = vmovlps_avx(auVar137);
                    local_62c.y = (float)uVar177;
                    local_62c.z = SUB84(uVar177,4);
                    fVar218 = local_588._0_4_;
                    auVar121 = vmovshdup_avx(auVar137);
                    fVar221 = fVar218 * auVar137._0_4_ + auVar125._0_4_;
                    fVar248 = fVar218 * auVar121._0_4_ + auVar123._0_4_;
                    iVar117 = *(int *)((long)puVar112 + 0x11c);
                    iVar118 = *(int *)(puVar112 + 0x23);
                    auVar119._0_4_ =
                         (float)((uint)bVar7 *
                                 (int)(((float)local_5c8._8_4_ - auVar119._0_4_) / fVar237) +
                                (uint)!bVar7 * (int)((float)local_5c8._8_4_ - auVar119._0_4_)) +
                         fVar218 * local_61c;
                    fVar237 = (float)iVar117;
                    auVar266._0_4_ = (float)(iVar117 + -1);
                    auVar266._4_12_ = auVar296;
                    auVar275._0_4_ = (float)(iVar118 + -1);
                    auVar275._4_12_ = auVar296;
                    auVar137 = vminss_avx(auVar266,ZEXT416((uint)(fVar248 * fVar237)));
                    uVar177 = vcmpss_avx512f(ZEXT416((uint)(fVar248 * fVar237)),auVar128,1);
                    fVar249 = (float)iVar118;
                    iVar101 = (int)(float)((uint)!(bool)((byte)uVar177 & 1) * auVar137._0_4_);
                    auVar137 = vminss_avx(auVar275,ZEXT416((uint)(fVar221 * fVar249)));
                    uVar177 = vcmpss_avx512f(ZEXT416((uint)(fVar221 * fVar249)),auVar128,1);
                    fVar257 = (float)*(int *)(puVar112 + 0x24);
                    auVar281._0_4_ = (float)(*(int *)(puVar112 + 0x24) + -1);
                    auVar281._4_12_ = auVar296;
                    iVar104 = (int)(float)((uint)!(bool)((byte)uVar177 & 1) * auVar137._0_4_);
                    auVar137 = vminss_avx(auVar281,ZEXT416((uint)(auVar119._0_4_ * fVar257)));
                    uVar177 = vcmpss_avx512f(ZEXT416((uint)(auVar119._0_4_ * fVar257)),auVar128,1);
                    iVar115 = (int)(float)((uint)!(bool)((byte)uVar177 & 1) * auVar137._0_4_);
                    do {
                      iVar106 = (int)lVar109;
                      if (iVar106 == 1) {
                        local_5f0[1] = iVar101;
                        piVar110 = local_54c + 1;
                        piVar111 = local_54c + 4;
                        pfVar100 = local_534 + 1;
                        pfVar108 = local_5e4 + 1;
                        pfVar99 = &local_62c.z;
                        iVar97 = iVar101;
                      }
                      else if (iVar106 == 0) {
                        local_5f0[lVar109] = iVar104;
                        piVar110 = local_54c;
                        piVar111 = local_54c + 3;
                        pfVar100 = local_534;
                        pfVar108 = local_5e4;
                        pfVar99 = &local_62c.y;
                        iVar97 = iVar104;
                      }
                      else {
                        piVar110 = local_54c + 2;
                        piVar111 = local_54c + 5;
                        pfVar100 = local_534 + 2;
                        pfVar108 = local_5e4 + 2;
                        pfVar99 = &local_61c;
                        local_5f0[lVar109] = iVar115;
                        iVar97 = iVar115;
                      }
                      if ((*pfVar99 == 0.0) && (!NAN(*pfVar99))) {
                        pfVar99 = &local_62c.y;
                        if ((iVar106 != 0) && (pfVar99 = &local_62c.z, iVar106 != 1)) {
                          pfVar99 = &local_61c;
                        }
                        *pfVar99 = 0.0;
                      }
                      pfVar99 = &local_62c.y;
                      if ((iVar106 != 0) && (pfVar99 = &local_62c.z, iVar106 != 1)) {
                        pfVar99 = &local_61c;
                      }
                      if (0.0 <= *pfVar99) {
                        fVar270 = (float)(iVar97 + 1);
                        if (iVar106 == 1) {
                          *pfVar108 = fVar218 + (fVar270 / fVar237 - fVar248) / local_62c.z;
                          fVar270 = local_62c.z * fVar237;
                          piVar98 = local_498;
                        }
                        else if (iVar106 == 0) {
                          *pfVar108 = fVar218 + (fVar270 / fVar249 - fVar221) / local_62c.y;
                          fVar270 = local_62c.y * fVar249;
                          piVar98 = piVar1;
                        }
                        else {
                          *pfVar108 = fVar218 + (fVar270 / fVar257 - auVar119._0_4_) / local_61c;
                          fVar270 = local_61c * fVar257;
                          piVar98 = (int *)(puVar112 + 0x24);
                        }
                        *piVar111 = 1;
                        *pfVar100 = 1.0 / fVar270;
                        iVar106 = *piVar98;
                      }
                      else {
                        fVar270 = (float)iVar97;
                        if (iVar106 == 1) {
                          fVar270 = fVar270 / fVar237 - fVar248;
                          piVar98 = local_498;
                          fVar220 = local_62c.z;
                        }
                        else if (iVar106 == 0) {
                          fVar270 = fVar270 / fVar249 - fVar221;
                          piVar98 = piVar1;
                          fVar220 = local_62c.y;
                        }
                        else {
                          fVar270 = fVar270 / fVar257 - auVar119._0_4_;
                          piVar98 = (int *)(puVar112 + 0x24);
                          fVar220 = local_61c;
                        }
                        *pfVar108 = fVar218 + fVar270 / fVar220;
                        iVar97 = *piVar98;
                        *piVar111 = -1;
                        iVar106 = -1;
                        *pfVar100 = -1.0 / (fVar220 * (float)iVar97);
                      }
                      lVar109 = lVar109 + 1;
                      *piVar110 = iVar106;
                    } while (lVar109 != 3);
                    auVar269 = ZEXT464((uint)local_598._0_4_);
                    auVar283 = ZEXT464((uint)local_4b8._0_4_);
                    auVar137 = _local_588;
                    auVar120 = local_618;
                    while( true ) {
                      auVar292 = ZEXT1664(auVar137);
                      lVar109 = (long)*(int *)(&DAT_0286b0a0 +
                                              (ulong)((uint)(local_5e4[1] < local_5e4[2]) |
                                                     (uint)(local_5e4[0] < local_5e4[1]) * 4 +
                                                     (uint)(local_5e4[0] < local_5e4[2]) * 2) * 4);
                      auVar119._0_4_ = local_5e4[lVar109];
                      auVar123 = vminss_avx(ZEXT416((uint)auVar119._0_4_),auVar283._0_16_);
                      auVar295 = ZEXT1664(auVar123);
                      uVar256 = *(undefined4 *)
                                 (puVar112[0x20] +
                                 ((long)((iVar117 * local_5f0[2] + local_5f0[1]) * iVar118) +
                                 (long)local_5f0[0]) * 4);
                      auVar66._4_4_ = uVar256;
                      auVar66._0_4_ = uVar256;
                      auVar66._8_4_ = uVar256;
                      auVar66._12_4_ = uVar256;
                      auVar121 = vmulps_avx512vl(auVar236._0_16_,auVar66);
                      fVar221 = auVar121._0_4_;
                      if ((fVar221 != 0.0) || (NAN(fVar221))) {
                        local_558 = (int *)CONCAT44(local_558._4_4_,auVar119._0_4_);
                        local_4f8 = (undefined1  [8])(auVar121._0_8_ ^ 0x8000000080000000);
                        fStack_4f0 = -auVar121._8_4_;
                        fStack_4ec = -auVar121._12_4_;
                        _local_5d8 = auVar120;
                        _local_568 = auVar121;
                        local_534[3] = auVar123._0_4_;
                        while( true ) {
                          local_588._0_4_ = auVar292._0_4_;
                          auVar119._0_4_ = logf(1.0 - auVar269._0_4_);
                          pSVar114 = local_510;
                          uVar88 = local_578.state;
                          auVar295 = ZEXT464((uint)local_534[3]);
                          uVar103 = local_578.state >> 0x1b;
                          local_578.state = local_578.state * 0x5851f42d4c957f2d + local_578.inc;
                          uVar92 = (uint)(uVar88 >> 0x2d) ^ (uint)uVar103;
                          bVar95 = (byte)(uVar88 >> 0x3b);
                          auVar119._0_4_ =
                               (float)local_588._0_4_ - auVar119._0_4_ / (float)local_568._0_4_;
                          auVar292 = ZEXT464((uint)auVar119._0_4_);
                          auVar137 = vcvtusi2ss_avx512f(in_XMM13,uVar92 >> bVar95 |
                                                                 uVar92 << 0x20 - bVar95);
                          auVar137 = vminss_avx(ZEXT416((uint)(auVar137._0_4_ * 2.3283064e-10)),
                                                ZEXT416(0x3f7fffff));
                          auVar269 = ZEXT1664(auVar137);
                          if (local_534[3] <= auVar119._0_4_) break;
                          if (auVar119._0_4_ < (float)local_4b8._0_4_) {
                            fVar221 = auVar119._0_4_ - (float)local_588._0_4_;
                            auVar232._8_4_ = 0x3da00ac9;
                            auVar232._0_8_ = 0x3da00ac93da00ac9;
                            auVar232._12_4_ = 0x3da00ac9;
                            auVar246._8_4_ = 0xffffff81;
                            auVar246._0_8_ = 0xffffff81ffffff81;
                            auVar246._12_4_ = 0xffffff81;
                            local_598._0_4_ = auVar137._0_4_;
                            _local_588 = ZEXT416((uint)auVar119._0_4_);
                            auVar148._0_4_ = fVar221 * (float)local_4f8._0_4_;
                            auVar148._4_4_ = fVar221 * (float)local_4f8._4_4_;
                            auVar148._8_4_ = fVar221 * fStack_4f0;
                            auVar148._12_4_ = fVar221 * fStack_4ec;
                            auVar73._8_4_ = 0x3fb8aa3b;
                            auVar73._0_8_ = 0x3fb8aa3b3fb8aa3b;
                            auVar73._12_4_ = 0x3fb8aa3b;
                            auVar123 = vmulps_avx512vl(auVar148,auVar73);
                            auVar137 = vroundps_avx(auVar123,9);
                            auVar123 = vsubps_avx(auVar123,auVar137);
                            auVar74._8_4_ = 0x3e679a0b;
                            auVar74._0_8_ = 0x3e679a0b3e679a0b;
                            auVar74._12_4_ = 0x3e679a0b;
                            auVar121 = vfmadd213ps_avx512vl(auVar232,auVar123,auVar74);
                            auVar194._0_4_ = (int)auVar137._0_4_;
                            auVar194._4_4_ = (int)auVar137._4_4_;
                            auVar194._8_4_ = (int)auVar137._8_4_;
                            auVar194._12_4_ = (int)auVar137._12_4_;
                            auVar137 = vpaddd_avx(auVar194,auVar246);
                            auVar75._8_4_ = 0x3f321004;
                            auVar75._0_8_ = 0x3f3210043f321004;
                            auVar75._12_4_ = 0x3f321004;
                            auVar121 = vfmadd213ps_avx512vl(auVar121,auVar123,auVar75);
                            auVar123 = vfmadd213ps_fma(auVar121,auVar123,local_618);
                            auVar121 = vpsrld_avx(auVar123,0x17);
                            auVar137 = vpaddd_avx(auVar137,auVar121);
                            auVar76._8_4_ = 0x807fffff;
                            auVar76._0_8_ = 0x807fffff807fffff;
                            auVar76._12_4_ = 0x807fffff;
                            auVar123 = vpandd_avx512vl(auVar123,auVar76);
                            auVar77._8_4_ = 0x7f;
                            auVar77._0_8_ = 0x7f0000007f;
                            auVar77._12_4_ = 0x7f;
                            uVar103 = vpcmpgtd_avx512vl(auVar137,auVar77);
                            uVar103 = uVar103 & 0xf;
                            uVar105 = vpcmpgtd_avx512vl(auVar137,auVar246);
                            uVar105 = uVar105 & 0xf;
                            auVar137 = vpslld_avx(auVar137,0x17);
                            auVar78._8_4_ = 0x3f800000;
                            auVar78._0_8_ = 0x3f8000003f800000;
                            auVar78._12_4_ = 0x3f800000;
                            auVar137 = vpaddd_avx512vl(auVar137,auVar78);
                            auVar137 = vpord_avx512vl(auVar137,auVar123);
                            auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                            bVar91 = (bool)((byte)uVar103 & 1);
                            bVar7 = (bool)((byte)(uVar103 >> 1) & 1);
                            bVar5 = (bool)((byte)(uVar103 >> 2) & 1);
                            bVar6 = SUB81(uVar103 >> 3,0);
                            auVar195._0_4_ = auVar119._0_4_ * fStack_5bc + (float)local_5c8._0_8_;
                            auVar195._4_4_ =
                                 auVar119._0_4_ * (float)uStack_5b8 + SUB84(local_5c8._0_8_,4);
                            auVar195._8_4_ = auVar119._0_4_ * 0.0 + 0.0;
                            auVar195._12_4_ = auVar119._0_4_ * 0.0 + 0.0;
                            auVar219 = ZEXT856(auVar195._8_8_);
                            local_468._4_4_ =
                                 (uint)bVar7 * auVar123._4_4_ |
                                 (uint)!bVar7 * (uint)((byte)(uVar105 >> 1) & 1) * auVar137._4_4_;
                            local_468._0_4_ =
                                 (uint)bVar91 * auVar123._0_4_ |
                                 (uint)!bVar91 * (uint)((byte)uVar105 & 1) * auVar137._0_4_;
                            fStack_460 = (float)((uint)bVar5 * auVar123._8_4_ |
                                                (uint)!bVar5 *
                                                (uint)((byte)(uVar105 >> 2) & 1) * auVar137._8_4_);
                            fStack_45c = (float)((uint)bVar6 * auVar123._12_4_ |
                                                (uint)!bVar6 *
                                                (uint)(byte)(uVar105 >> 3) * auVar137._12_4_);
                            local_600._0_8_ = vmovlps_avx(auVar195);
                            local_600.z = auVar119._0_4_ * uStack_5b8._4_4_ + (float)local_5c8._8_4_
                            ;
                            auVar174 = (undefined1  [56])0x0;
                            SVar297 = NanoVDBMediumProvider::Density
                                                ((NanoVDBMediumProvider *)*puVar112,
                                                 (Point3f *)&local_600,local_510);
                            auVar215._0_8_ = SVar297.values.values._8_8_;
                            auVar215._8_56_ = auVar219;
                            auVar170._0_8_ = SVar297.values.values._0_8_;
                            auVar170._8_56_ = auVar174;
                            _local_478 = vmovlhps_avx(auVar170._0_16_,auVar215._0_16_);
                            auVar174 = ZEXT856(local_478._8_8_);
                            SVar297 = NanoVDBMediumProvider::Le
                                                ((NanoVDBMediumProvider *)*puVar112,
                                                 (Point3f *)&local_600,pSVar114);
                            auVar216._0_8_ = SVar297.values.values._8_8_;
                            auVar216._8_56_ = auVar219;
                            auVar171._0_8_ = SVar297.values.values._0_8_;
                            auVar171._8_56_ = auVar174;
                            auVar295 = ZEXT1664(CONCAT412(0x80000000,
                                                          CONCAT48(0x80000000,0x8000000080000000)));
                            local_2f8.values.values[0] = (float)local_478._0_4_ * local_418;
                            local_2f8.values.values[1] = (float)local_478._4_4_ * fStack_414;
                            local_2f8.values.values[2] = fStack_470 * fStack_410;
                            local_2f8.values.values[3] = fStack_46c * fStack_40c;
                            local_2c8.values.values[0] =
                                 (float)local_468._0_4_ * (float)local_5d8._0_4_;
                            local_2c8.values.values[1] =
                                 (float)local_468._4_4_ * (float)local_5d8._4_4_;
                            local_2c8.values.values[2] = fStack_460 * (float)uStack_5d0;
                            local_2c8.values.values[3] = fStack_45c * uStack_5d0._4_4_;
                            auVar119 = vfmadd231ss_fma(ZEXT416((uint)(local_600.y *
                                                                     *(float *)((long)puVar112 +
                                                                               0x7c))),
                                                       ZEXT416((uint)local_600.x),
                                                       ZEXT416(*(uint *)(puVar112 + 0xf)));
                            auVar137 = vfmadd231ss_fma(ZEXT416((uint)(local_600.y *
                                                                     *(float *)((long)puVar112 +
                                                                               0xac))),
                                                       ZEXT416((uint)local_600.x),
                                                       ZEXT416(*(uint *)(puVar112 + 0x15)));
                            auVar123 = vfmadd231ss_fma(ZEXT416((uint)(local_600.y *
                                                                     *(float *)((long)puVar112 +
                                                                               0x8c))),
                                                       ZEXT416((uint)local_600.x),
                                                       ZEXT416(*(uint *)(puVar112 + 0x11)));
                            auVar121 = vfmadd231ss_fma(ZEXT416((uint)(local_600.y *
                                                                     *(float *)((long)puVar112 +
                                                                               0x9c))),
                                                       ZEXT416((uint)local_600.x),
                                                       ZEXT416(*(uint *)(puVar112 + 0x13)));
                            auVar128 = vfmadd231ss_fma(auVar119,ZEXT416((uint)local_600.z),
                                                       ZEXT416(*(uint *)(puVar112 + 0x10)));
                            auVar119 = vfmadd231ss_fma(auVar137,ZEXT416((uint)local_600.z),
                                                       ZEXT416(*(uint *)(puVar112 + 0x16)));
                            auVar137 = vfmadd231ss_fma(auVar123,ZEXT416((uint)local_600.z),
                                                       ZEXT416(*(uint *)(puVar112 + 0x12)));
                            auVar123 = vfmadd231ss_fma(auVar121,ZEXT416((uint)local_600.z),
                                                       ZEXT416(*(uint *)(puVar112 + 0x14)));
                            auVar119._0_4_ = auVar119._0_4_ + *(float *)((long)puVar112 + 0xb4);
                            fVar221 = auVar128._0_4_ + *(float *)((long)puVar112 + 0x84);
                            fVar248 = auVar137._0_4_ + *(float *)((long)puVar112 + 0x94);
                            fVar237 = auVar123._0_4_ + *(float *)((long)puVar112 + 0xa4);
                            bVar91 = auVar119._0_4_ == 1.0;
                            iVar117 = (uint)bVar91 * (int)fVar221 +
                                      (uint)!bVar91 * (int)(fVar221 / auVar119._0_4_);
                            iVar118 = (uint)bVar91 * (int)fVar237 +
                                      (uint)!bVar91 * (int)(fVar237 / auVar119._0_4_);
                            iVar101 = (uint)bVar91 * (int)fVar248 +
                                      (uint)!bVar91 * (int)(fVar248 / auVar119._0_4_);
                            auVar276._4_4_ = iVar117;
                            auVar276._0_4_ = iVar117;
                            auVar276._8_4_ = iVar117;
                            auVar276._12_4_ = iVar117;
                            auVar282._4_4_ = iVar101;
                            auVar282._0_4_ = iVar101;
                            auVar282._8_4_ = iVar101;
                            auVar282._12_4_ = iVar101;
                            auVar267._4_4_ = iVar118;
                            auVar267._0_4_ = iVar118;
                            auVar267._8_4_ = iVar118;
                            auVar267._12_4_ = iVar118;
                            auVar137 = vmovlhps_avx(auVar276,auVar282);
                            local_338 = ZEXT416(0) << 0x20;
                            auVar291._0_4_ = local_440._12_4_ * local_440._12_4_;
                            auVar291._4_4_ = local_440._16_4_ * local_440._16_4_;
                            auVar291._8_8_ = 0;
                            auVar286._0_8_ = local_440._12_8_ ^ 0x8000000080000000;
                            auVar286._8_4_ = 0x80000000;
                            auVar286._12_4_ = 0x80000000;
                            auVar119 = vhaddps_avx(auVar291,auVar291);
                            auVar119 = ZEXT416((uint)(auVar119._0_4_ + fStack_42c * fStack_42c));
                            auVar119 = vsqrtss_avx(auVar119,auVar119);
                            local_2e8._16_16_ = vmovlhps_avx(auVar171._0_16_,auVar216._0_16_);
                            fStack_33c = auVar119._0_4_;
                            auVar294._4_4_ = fStack_33c;
                            auVar294._0_4_ = fStack_33c;
                            auVar294._8_4_ = fStack_33c;
                            auVar294._12_4_ = fStack_33c;
                            fStack_33c = -fStack_42c / fStack_33c;
                            auVar119 = vdivps_avx(auVar286,auVar294);
                            local_328 = 0.0;
                            local_360._0_8_ = auVar137._0_8_;
                            local_360._8_4_ = auVar137._8_4_;
                            local_360._12_4_ = auVar137._12_4_;
                            local_360._16_8_ = vmovlps_avx(auVar267);
                            local_360._24_4_ = FStack_428;
                            uVar177 = vmovlps_avx(auVar119);
                            fStack_344 = (float)uVar177;
                            fStack_340 = (float)((ulong)uVar177 >> 0x20);
                            local_320 = (MediumInterface *)0x0;
                            local_308.values.values[1] =
                                 (float)local_478._4_4_ * (float)local_488._4_4_;
                            local_308.values.values[0] =
                                 (float)local_478._0_4_ * (float)local_488._0_4_;
                            local_308.values.values[2] = fStack_470 * fStack_480;
                            local_308.values.values[3] = fStack_46c * fStack_47c;
                            local_2e8._0_16_ = _local_568;
                            local_318.bits = (ulong)puVar112 | 0x4000000000000;
                            local_310.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                                 (TaggedPointer<pbrt::HGPhaseFunction>)
                                 (TaggedPointer<pbrt::HGPhaseFunction>)
                                 ((long)puVar112 + 0x74U | 0x1000000000000);
                            bVar91 = SampleLd::anon_class_32_4_3820c045::operator()
                                               (&local_3d0,(MediumSample *)local_360);
                            pSVar114 = local_510;
                            pVVar116 = local_4d0;
                            auVar120 = local_618;
                            if (!bVar91) goto LAB_003cfc73;
                            auVar269 = ZEXT464((uint)local_598._0_4_);
                            auVar292 = ZEXT1664(_local_588);
                            _local_5d8 = local_618;
                          }
                        }
                        auVar119._0_4_ = local_534[3] - (float)local_588._0_4_;
                        auVar233._8_4_ = 0x3da00ac9;
                        auVar233._0_8_ = 0x3da00ac93da00ac9;
                        auVar233._12_4_ = 0x3da00ac9;
                        auVar247._8_4_ = 0xffffff81;
                        auVar247._0_8_ = 0xffffff81ffffff81;
                        auVar247._12_4_ = 0xffffff81;
                        auVar283 = ZEXT464((uint)local_4b8._0_4_);
                        auVar236 = ZEXT1664(local_3e8);
                        auVar149._0_4_ = auVar119._0_4_ * (float)local_4f8._0_4_;
                        auVar149._4_4_ = auVar119._0_4_ * (float)local_4f8._4_4_;
                        auVar149._8_4_ = auVar119._0_4_ * fStack_4f0;
                        auVar149._12_4_ = auVar119._0_4_ * fStack_4ec;
                        auVar79._8_4_ = 0x3fb8aa3b;
                        auVar79._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar79._12_4_ = 0x3fb8aa3b;
                        auVar137 = vmulps_avx512vl(auVar149,auVar79);
                        auVar119 = vroundps_avx(auVar137,9);
                        auVar137 = vsubps_avx(auVar137,auVar119);
                        auVar80._8_4_ = 0x3e679a0b;
                        auVar80._0_8_ = 0x3e679a0b3e679a0b;
                        auVar80._12_4_ = 0x3e679a0b;
                        auVar123 = vfmadd213ps_avx512vl(auVar233,auVar137,auVar80);
                        auVar196._0_4_ = (int)auVar119._0_4_;
                        auVar196._4_4_ = (int)auVar119._4_4_;
                        auVar196._8_4_ = (int)auVar119._8_4_;
                        auVar196._12_4_ = (int)auVar119._12_4_;
                        auVar119 = vpaddd_avx(auVar196,auVar247);
                        auVar81._8_4_ = 0x3f321004;
                        auVar81._0_8_ = 0x3f3210043f321004;
                        auVar81._12_4_ = 0x3f321004;
                        auVar123 = vfmadd213ps_avx512vl(auVar123,auVar137,auVar81);
                        auVar137 = vfmadd213ps_fma(auVar123,auVar137,local_618);
                        auVar123 = vpsrld_avx(auVar137,0x17);
                        auVar119 = vpaddd_avx(auVar119,auVar123);
                        auVar82._8_4_ = 0x7f;
                        auVar82._0_8_ = 0x7f0000007f;
                        auVar82._12_4_ = 0x7f;
                        uVar103 = vpcmpgtd_avx512vl(auVar119,auVar82);
                        auVar83._8_4_ = 0x807fffff;
                        auVar83._0_8_ = 0x807fffff807fffff;
                        auVar83._12_4_ = 0x807fffff;
                        auVar121 = vpandd_avx512vl(auVar137,auVar83);
                        uVar105 = vpcmpgtd_avx512vl(auVar119,auVar247);
                        auVar119 = vpslld_avx(auVar119,0x17);
                        auVar84._8_4_ = 0x3f800000;
                        auVar84._0_8_ = 0x3f8000003f800000;
                        auVar84._12_4_ = 0x3f800000;
                        auVar123 = vpaddd_avx512vl(auVar119,auVar84);
                        auVar119._0_4_ = local_558._0_4_;
                        auVar137 = _local_5d8;
                      }
                      else {
                        fVar248 = auVar123._0_4_ - auVar137._0_4_;
                        auVar231._8_4_ = 0x3da00ac9;
                        auVar231._0_8_ = 0x3da00ac93da00ac9;
                        auVar231._12_4_ = 0x3da00ac9;
                        auVar253._8_4_ = 0xffffff81;
                        auVar253._0_8_ = 0xffffff81ffffff81;
                        auVar253._12_4_ = 0xffffff81;
                        auVar147._0_4_ = fVar248 * -fVar221;
                        auVar147._4_4_ = fVar248 * -auVar121._4_4_;
                        auVar147._8_4_ = fVar248 * -auVar121._8_4_;
                        auVar147._12_4_ = fVar248 * -auVar121._12_4_;
                        auVar67._8_4_ = 0x3fb8aa3b;
                        auVar67._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar67._12_4_ = 0x3fb8aa3b;
                        auVar123 = vmulps_avx512vl(auVar147,auVar67);
                        auVar137 = vroundps_avx(auVar123,9);
                        auVar123 = vsubps_avx(auVar123,auVar137);
                        auVar68._8_4_ = 0x3e679a0b;
                        auVar68._0_8_ = 0x3e679a0b3e679a0b;
                        auVar68._12_4_ = 0x3e679a0b;
                        auVar121 = vfmadd213ps_avx512vl(auVar231,auVar123,auVar68);
                        auVar193._0_4_ = (int)auVar137._0_4_;
                        auVar193._4_4_ = (int)auVar137._4_4_;
                        auVar193._8_4_ = (int)auVar137._8_4_;
                        auVar193._12_4_ = (int)auVar137._12_4_;
                        auVar137 = vpaddd_avx(auVar193,auVar253);
                        auVar69._8_4_ = 0x3f321004;
                        auVar69._0_8_ = 0x3f3210043f321004;
                        auVar69._12_4_ = 0x3f321004;
                        auVar121 = vfmadd213ps_avx512vl(auVar121,auVar123,auVar69);
                        auVar123 = vfmadd213ps_fma(auVar121,auVar123,local_618);
                        auVar121 = vpsrld_avx(auVar123,0x17);
                        auVar137 = vpaddd_avx(auVar137,auVar121);
                        auVar70._8_4_ = 0x7f;
                        auVar70._0_8_ = 0x7f0000007f;
                        auVar70._12_4_ = 0x7f;
                        uVar103 = vpcmpgtd_avx512vl(auVar137,auVar70);
                        auVar71._8_4_ = 0x807fffff;
                        auVar71._0_8_ = 0x807fffff807fffff;
                        auVar71._12_4_ = 0x807fffff;
                        auVar121 = vpandd_avx512vl(auVar123,auVar71);
                        uVar105 = vpcmpgtd_avx512vl(auVar137,auVar253);
                        auVar137 = vpslld_avx(auVar137,0x17);
                        auVar72._8_4_ = 0x3f800000;
                        auVar72._0_8_ = 0x3f8000003f800000;
                        auVar72._12_4_ = 0x3f800000;
                        auVar123 = vpaddd_avx512vl(auVar137,auVar72);
                        auVar137 = auVar120;
                      }
                      uVar103 = uVar103 & 0xf;
                      uVar105 = uVar105 & 0xf;
                      auVar123 = vpord_avx512vl(auVar123,auVar121);
                      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                      bVar91 = (bool)((byte)uVar103 & 1);
                      bVar7 = (bool)((byte)(uVar103 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar103 >> 2) & 1);
                      bVar6 = SUB81(uVar103 >> 3,0);
                      auVar120._0_4_ =
                           (float)((uint)bVar91 * auVar121._0_4_ |
                                  (uint)!bVar91 * (uint)((byte)uVar105 & 1) * auVar123._0_4_) *
                           auVar137._0_4_;
                      auVar120._4_4_ =
                           (float)((uint)bVar7 * auVar121._4_4_ |
                                  (uint)!bVar7 * (uint)((byte)(uVar105 >> 1) & 1) * auVar123._4_4_)
                           * auVar137._4_4_;
                      auVar120._8_4_ =
                           (float)((uint)bVar5 * auVar121._8_4_ |
                                  (uint)!bVar5 * (uint)((byte)(uVar105 >> 2) & 1) * auVar123._8_4_)
                           * auVar137._8_4_;
                      auVar120._12_4_ =
                           (float)((uint)bVar6 * auVar121._12_4_ |
                                  (uint)!bVar6 * (uint)(byte)(uVar105 >> 3) * auVar123._12_4_) *
                           auVar137._12_4_;
                      pSVar114 = local_510;
                      pVVar116 = local_4d0;
                      if ((auVar283._0_4_ < auVar119._0_4_) ||
                         (iVar117 = local_5f0[lVar109], iVar118 = local_54c[lVar109 + 3],
                         local_5f0[lVar109] = iVar117 + iVar118, piVar1 = local_498,
                         pSVar114 = local_510, pVVar116 = local_4d0,
                         iVar117 + iVar118 == local_54c[lVar109])) break;
                      auVar87 = local_508;
                      auVar137 = auVar295._0_16_;
                      local_5e4[lVar109] = auVar119._0_4_ + local_534[lVar109];
                      iVar118 = *(int *)auVar87;
                      iVar117 = *piVar1;
                    }
                  }
                  goto LAB_003cfc73;
                }
                if ((local_298.bits & 0x3000000000000) == 0x2000000000000) {
                  local_3d0.T_ray = &local_4c8;
                  local_3d0.lightPathPDF = &local_4e8;
                  puVar112 = (undefined8 *)(local_298.bits & 0xffffffffffff);
                  local_3d0.uniPathPDF = &local_458;
                  unique0x000f4700 = vmovlhps_avx(auVar250,auVar178);
                  local_440._0_8_ = vmovlps_avx(auVar238);
                  local_440._8_4_ = IStack_2b0.low;
                  local_3d0.rng = &local_578;
                  local_420.bits = local_298.bits;
                  auVar295 = ZEXT1664(auVar119);
                  local_62c.x = (float)uVar256;
                  Transform::ApplyInverse
                            ((Ray *)local_5c8,(Transform *)(puVar112 + 0xf),(Ray *)local_440,
                             &local_62c.x);
                  auVar296 = auVar295._4_12_;
                  auVar129._4_4_ = (float)uStack_5b8;
                  auVar129._0_4_ = fStack_5bc;
                  auVar129._8_8_ = 0;
                  auVar123 = ZEXT816(0) << 0x40;
                  bVar91 = false;
                  uVar92 = 0;
                  auVar179._0_4_ = fStack_5bc * fStack_5bc;
                  auVar179._4_4_ = (float)uStack_5b8 * (float)uStack_5b8;
                  auVar179._8_8_ = 0;
                  auVar119 = vhaddps_avx(auVar179,auVar179);
                  auVar119 = ZEXT416((uint)(auVar119._0_4_ + uStack_5b8._4_4_ * uStack_5b8._4_4_));
                  auVar119 = vsqrtss_avx(auVar119,auVar119);
                  auVar236 = ZEXT464((uint)(auVar119._0_4_ * local_62c.x));
                  auVar239._4_4_ = auVar119._0_4_;
                  auVar239._0_4_ = auVar119._0_4_;
                  auVar239._8_4_ = auVar119._0_4_;
                  auVar239._12_4_ = auVar119._0_4_;
                  uStack_5b8._4_4_ = uStack_5b8._4_4_ / auVar119._0_4_;
                  auVar137 = vdivps_avx(auVar129,auVar239);
                  local_62c.x = auVar119._0_4_ * local_62c.x;
                  uVar177 = vmovlps_avx(auVar137);
                  fStack_5bc = (float)uVar177;
                  uStack_5b8._0_4_ = (float)((ulong)uVar177 >> 0x20);
                  auVar119 = vmovshdup_avx(auVar137);
                  fVar221 = 1.0 / auVar137._0_4_;
                  fVar248 = 1.0 / uStack_5b8._4_4_;
                  auVar119._0_4_ = 1.0 / auVar119._0_4_;
                  auVar174 = (undefined1  [56])0x0;
                  do {
                    auVar137 = ZEXT416((uint)(fVar221 *
                                             (*(float *)(puVar112 + 1) - (float)local_5c8._0_4_)));
                    pfVar99 = (float *)((long)puVar112 + 0x14);
                    pfVar108 = (float *)local_5c8;
                    fVar237 = fVar221;
                    if (uVar92 != 0) {
                      pfVar108 = (float *)(local_5c8 + 4);
                      auVar137 = ZEXT416((uint)(auVar119._0_4_ *
                                               (*(float *)((long)puVar112 + 0xc) -
                                               (float)local_5c8._4_4_)));
                      pfVar99 = (float *)(puVar112 + 3);
                      fVar237 = auVar119._0_4_;
                      if (uVar92 != 1) {
                        pfVar108 = (float *)(local_5c8 + 8);
                        auVar137 = ZEXT416((uint)(fVar248 *
                                                 (*(float *)(puVar112 + 2) - (float)local_5c8._8_4_)
                                                 ));
                        pfVar99 = (float *)((long)puVar112 + 0x1c);
                        fVar237 = fVar248;
                      }
                    }
                    auVar128 = ZEXT416((uint)((*pfVar99 - *pfVar108) * fVar237));
                    auVar121 = vminss_avx(auVar128,auVar137);
                    auVar137 = vmaxss_avx(auVar137,auVar128);
                    auVar123 = vmaxss_avx(auVar121,auVar123);
                    auVar137 = vminss_avx(ZEXT416((uint)(auVar137._0_4_ * 1.0000004)),
                                          auVar236._0_16_);
                    auVar236 = ZEXT1664(auVar137);
                    if (auVar137._0_4_ < auVar123._0_4_) {
                      auVar120 = local_618;
                      if (!bVar91) goto LAB_003cfc73;
                      break;
                    }
                    bVar91 = 1 < uVar92;
                    uVar92 = uVar92 + 1;
                  } while (uVar92 != 3);
                  uVar256 = *(undefined4 *)(puVar112 + 0xe);
                  local_5d8._4_4_ = uVar256;
                  local_5d8._0_4_ = uVar256;
                  uStack_5d0._0_4_ = (float)uVar256;
                  uStack_5d0._4_4_ = (float)uVar256;
                  auVar219 = ZEXT856(local_5d8._8_8_);
                  local_4b8._0_4_ = auVar137._0_4_;
                  _local_588 = auVar123;
                  SVar297 = DenselySampledSpectrum::Sample
                                      ((DenselySampledSpectrum *)(puVar112 + 4),pSVar114);
                  auVar206._0_8_ = SVar297.values.values._8_8_;
                  auVar206._8_56_ = auVar174;
                  auVar161._0_8_ = SVar297.values.values._0_8_;
                  auVar161._8_56_ = auVar219;
                  auVar119 = vmovlhps_avx(auVar161._0_16_,auVar206._0_16_);
                  local_488._4_4_ = auVar119._4_4_ * (float)local_5d8._4_4_;
                  local_488._0_4_ = auVar119._0_4_ * (float)local_5d8._0_4_;
                  fStack_480 = auVar119._8_4_ * (float)uStack_5d0;
                  fStack_47c = auVar119._12_4_ * uStack_5d0._4_4_;
                  uVar256 = *(undefined4 *)(puVar112 + 0xe);
                  local_5d8._4_4_ = uVar256;
                  local_5d8._0_4_ = uVar256;
                  uStack_5d0._0_4_ = (float)uVar256;
                  uStack_5d0._4_4_ = (float)uVar256;
                  auVar219 = ZEXT856(local_5d8._8_8_);
                  SVar297 = DenselySampledSpectrum::Sample
                                      ((DenselySampledSpectrum *)(puVar112 + 9),pSVar114);
                  pVVar116 = local_4d0;
                  pSVar114 = local_510;
                  auVar207._0_8_ = SVar297.values.values._8_8_;
                  auVar207._8_56_ = auVar174;
                  auVar162._0_8_ = SVar297.values.values._0_8_;
                  auVar162._8_56_ = auVar219;
                  auVar119 = vmovlhps_avx(auVar162._0_16_,auVar207._0_16_);
                  local_418 = auVar119._0_4_ * (float)local_5d8._0_4_;
                  fStack_414 = auVar119._4_4_ * (float)local_5d8._4_4_;
                  fStack_410 = auVar119._8_4_ * (float)uStack_5d0;
                  fStack_40c = auVar119._12_4_ * uStack_5d0._4_4_;
                  auVar259._8_8_ = 0;
                  auVar259._0_8_ = local_5c8._0_8_;
                  piVar1 = (int *)(puVar112 + 0x23);
                  auVar128 = ZEXT816(0) << 0x40;
                  lVar109 = 0;
                  local_508 = (undefined1  [8])piVar1;
                  local_3e8._0_4_ = local_418 + (float)local_488._0_4_;
                  local_3e8._4_4_ = fStack_414 + (float)local_488._4_4_;
                  local_3e8._8_4_ = fStack_410 + fStack_480;
                  local_3e8._12_4_ = fStack_40c + fStack_47c;
                  auVar236 = ZEXT1664(local_3e8);
                  auVar119._0_4_ = *(float *)(puVar112 + 2);
                  fVar237 = *(float *)((long)puVar112 + 0x1c) - auVar119._0_4_;
                  uVar177 = vcmpss_avx512f(ZEXT416((uint)auVar119._0_4_),
                                           ZEXT416((uint)*(float *)((long)puVar112 + 0x1c)),1);
                  bVar7 = (bool)((byte)uVar177 & 1);
                  auVar183._8_8_ = 0;
                  auVar183._0_8_ = *(ulong *)((long)puVar112 + 0x14);
                  auVar134._8_8_ = 0;
                  auVar134._0_8_ = puVar112[1];
                  auVar137 = vsubps_avx(auVar183,auVar134);
                  auVar123 = vsubps_avx(auVar259,auVar134);
                  uVar103 = vcmpps_avx512vl(auVar134,auVar183,1);
                  auVar135._4_4_ = (float)uStack_5b8;
                  auVar135._0_4_ = fStack_5bc;
                  auVar135._8_8_ = 0;
                  auVar121 = vdivps_avx512vl(auVar123,auVar137);
                  bVar91 = (bool)((byte)uVar103 & 1);
                  auVar122._0_4_ =
                       (float)((uint)bVar91 * auVar121._0_4_ | (uint)!bVar91 * auVar123._0_4_);
                  bVar91 = (bool)((byte)(uVar103 >> 1) & 1);
                  auVar122._4_4_ = (uint)bVar91 * auVar121._4_4_ | (uint)!bVar91 * auVar123._4_4_;
                  bVar91 = (bool)((byte)(uVar103 >> 2) & 1);
                  auVar122._8_4_ = (uint)bVar91 * auVar121._8_4_ | (uint)!bVar91 * auVar123._8_4_;
                  bVar91 = (bool)((byte)(uVar103 >> 3) & 1);
                  auVar122._12_4_ = (uint)bVar91 * auVar121._12_4_ | (uint)!bVar91 * auVar123._12_4_
                  ;
                  auVar137 = vdivps_avx(auVar135,auVar137);
                  auVar123 = vmovshdup_avx(auVar122);
                  local_61c = uStack_5b8._4_4_ / fVar237;
                  uVar177 = vmovlps_avx(auVar137);
                  local_62c.y = (float)uVar177;
                  local_62c.z = SUB84(uVar177,4);
                  fVar218 = local_588._0_4_;
                  auVar121 = vmovshdup_avx(auVar137);
                  fVar221 = fVar218 * auVar137._0_4_ + auVar122._0_4_;
                  fVar248 = fVar218 * auVar121._0_4_ + auVar123._0_4_;
                  iVar117 = *(int *)((long)puVar112 + 0x11c);
                  iVar118 = *(int *)(puVar112 + 0x23);
                  auVar119._0_4_ =
                       (float)((uint)bVar7 *
                               (int)(((float)local_5c8._8_4_ - auVar119._0_4_) / fVar237) +
                              (uint)!bVar7 * (int)((float)local_5c8._8_4_ - auVar119._0_4_)) +
                       fVar218 * local_61c;
                  fVar237 = (float)iVar117;
                  auVar260._0_4_ = (float)(iVar117 + -1);
                  auVar260._4_12_ = auVar296;
                  local_498 = (int *)((long)puVar112 + 0x11c);
                  auVar271._0_4_ = (float)(iVar118 + -1);
                  auVar271._4_12_ = auVar296;
                  auVar137 = vminss_avx(auVar260,ZEXT416((uint)(fVar248 * fVar237)));
                  uVar177 = vcmpss_avx512f(ZEXT416((uint)(fVar248 * fVar237)),auVar128,1);
                  fVar249 = (float)iVar118;
                  iVar115 = (int)(float)((uint)!(bool)((byte)uVar177 & 1) * auVar137._0_4_);
                  auVar137 = vminss_avx(auVar271,ZEXT416((uint)(fVar221 * fVar249)));
                  uVar177 = vcmpss_avx512f(ZEXT416((uint)(fVar221 * fVar249)),auVar128,1);
                  fVar257 = (float)*(int *)(puVar112 + 0x24);
                  auVar277._0_4_ = (float)(*(int *)(puVar112 + 0x24) + -1);
                  auVar277._4_12_ = auVar296;
                  iVar101 = (int)(float)((uint)!(bool)((byte)uVar177 & 1) * auVar137._0_4_);
                  auVar137 = vminss_avx(auVar277,ZEXT416((uint)(auVar119._0_4_ * fVar257)));
                  uVar177 = vcmpss_avx512f(ZEXT416((uint)(auVar119._0_4_ * fVar257)),auVar128,1);
                  iVar104 = (int)(float)((uint)!(bool)((byte)uVar177 & 1) * auVar137._0_4_);
                  do {
                    iVar106 = (int)lVar109;
                    if (iVar106 == 1) {
                      local_5f0[1] = iVar115;
                      piVar110 = local_54c + 1;
                      piVar111 = local_54c + 4;
                      pfVar100 = local_534 + 1;
                      pfVar108 = local_5e4 + 1;
                      pfVar99 = &local_62c.z;
                      iVar97 = iVar115;
                    }
                    else if (iVar106 == 0) {
                      local_5f0[lVar109] = iVar101;
                      piVar110 = local_54c;
                      piVar111 = local_54c + 3;
                      pfVar100 = local_534;
                      pfVar108 = local_5e4;
                      pfVar99 = &local_62c.y;
                      iVar97 = iVar101;
                    }
                    else {
                      piVar110 = local_54c + 2;
                      piVar111 = local_54c + 5;
                      pfVar100 = local_534 + 2;
                      pfVar108 = local_5e4 + 2;
                      pfVar99 = &local_61c;
                      local_5f0[lVar109] = iVar104;
                      iVar97 = iVar104;
                    }
                    if ((*pfVar99 == 0.0) && (!NAN(*pfVar99))) {
                      pfVar99 = &local_62c.y;
                      if ((iVar106 != 0) && (pfVar99 = &local_62c.z, iVar106 != 1)) {
                        pfVar99 = &local_61c;
                      }
                      *pfVar99 = 0.0;
                    }
                    pfVar99 = &local_62c.y;
                    if ((iVar106 != 0) && (pfVar99 = &local_62c.z, iVar106 != 1)) {
                      pfVar99 = &local_61c;
                    }
                    if (0.0 <= *pfVar99) {
                      fVar270 = (float)(iVar97 + 1);
                      if (iVar106 == 1) {
                        *pfVar108 = fVar218 + (fVar270 / fVar237 - fVar248) / local_62c.z;
                        fVar270 = local_62c.z * fVar237;
                        piVar98 = local_498;
                      }
                      else if (iVar106 == 0) {
                        *pfVar108 = fVar218 + (fVar270 / fVar249 - fVar221) / local_62c.y;
                        fVar270 = local_62c.y * fVar249;
                        piVar98 = piVar1;
                      }
                      else {
                        *pfVar108 = fVar218 + (fVar270 / fVar257 - auVar119._0_4_) / local_61c;
                        fVar270 = local_61c * fVar257;
                        piVar98 = (int *)(puVar112 + 0x24);
                      }
                      *piVar111 = 1;
                      *pfVar100 = 1.0 / fVar270;
                      iVar106 = *piVar98;
                    }
                    else {
                      fVar270 = (float)iVar97;
                      if (iVar106 == 1) {
                        fVar270 = fVar270 / fVar237 - fVar248;
                        piVar98 = local_498;
                        fVar220 = local_62c.z;
                      }
                      else if (iVar106 == 0) {
                        fVar270 = fVar270 / fVar249 - fVar221;
                        piVar98 = piVar1;
                        fVar220 = local_62c.y;
                      }
                      else {
                        fVar270 = fVar270 / fVar257 - auVar119._0_4_;
                        piVar98 = (int *)(puVar112 + 0x24);
                        fVar220 = local_61c;
                      }
                      *pfVar108 = fVar218 + fVar270 / fVar220;
                      iVar97 = *piVar98;
                      iVar106 = -1;
                      *piVar111 = -1;
                      *pfVar100 = -1.0 / (fVar220 * (float)iVar97);
                    }
                    lVar109 = lVar109 + 1;
                    *piVar110 = iVar106;
                  } while (lVar109 != 3);
                  auVar269 = ZEXT464((uint)local_598._0_4_);
                  auVar283 = ZEXT464((uint)local_4b8._0_4_);
                  auVar137 = _local_588;
                  auVar120 = local_618;
                  while( true ) {
                    auVar292 = ZEXT1664(auVar137);
                    lVar109 = (long)*(int *)(&DAT_0286b0a0 +
                                            (ulong)((uint)(local_5e4[1] < local_5e4[2]) |
                                                   (uint)(local_5e4[0] < local_5e4[1]) * 4 +
                                                   (uint)(local_5e4[0] < local_5e4[2]) * 2) * 4);
                    auVar119._0_4_ = local_5e4[lVar109];
                    auVar123 = vminss_avx(ZEXT416((uint)auVar119._0_4_),auVar283._0_16_);
                    auVar295 = ZEXT1664(auVar123);
                    uVar256 = *(undefined4 *)
                               (puVar112[0x20] +
                               ((long)((iVar117 * local_5f0[2] + local_5f0[1]) * iVar118) +
                               (long)local_5f0[0]) * 4);
                    auVar9._4_4_ = uVar256;
                    auVar9._0_4_ = uVar256;
                    auVar9._8_4_ = uVar256;
                    auVar9._12_4_ = uVar256;
                    auVar121 = vmulps_avx512vl(auVar236._0_16_,auVar9);
                    fVar221 = auVar121._0_4_;
                    if ((fVar221 != 0.0) || (NAN(fVar221))) {
                      local_558 = (int *)CONCAT44(local_558._4_4_,auVar119._0_4_);
                      local_4f8 = (undefined1  [8])(auVar121._0_8_ ^ 0x8000000080000000);
                      fStack_4f0 = -auVar121._8_4_;
                      fStack_4ec = -auVar121._12_4_;
                      _local_5d8 = auVar120;
                      _local_568 = auVar121;
                      local_534[3] = auVar123._0_4_;
                      while( true ) {
                        local_588._0_4_ = auVar292._0_4_;
                        auVar119._0_4_ = logf(1.0 - auVar269._0_4_);
                        uVar88 = local_578.state;
                        auVar295 = ZEXT464((uint)local_534[3]);
                        uVar103 = local_578.state >> 0x1b;
                        local_578.state = local_578.state * 0x5851f42d4c957f2d + local_578.inc;
                        uVar92 = (uint)(uVar88 >> 0x2d) ^ (uint)uVar103;
                        bVar95 = (byte)(uVar88 >> 0x3b);
                        auVar119._0_4_ =
                             (float)local_588._0_4_ - auVar119._0_4_ / (float)local_568._0_4_;
                        auVar292 = ZEXT464((uint)auVar119._0_4_);
                        auVar137 = vcvtusi2ss_avx512f(in_XMM13,uVar92 >> bVar95 |
                                                               uVar92 << 0x20 - bVar95);
                        auVar137 = vminss_avx(ZEXT416((uint)(auVar137._0_4_ * 2.3283064e-10)),
                                              ZEXT416(0x3f7fffff));
                        auVar269 = ZEXT1664(auVar137);
                        if (local_534[3] <= auVar119._0_4_) break;
                        if (auVar119._0_4_ < (float)local_4b8._0_4_) {
                          fVar221 = auVar119._0_4_ - (float)local_588._0_4_;
                          auVar226._8_4_ = 0x3da00ac9;
                          auVar226._0_8_ = 0x3da00ac93da00ac9;
                          auVar226._12_4_ = 0x3da00ac9;
                          auVar242._8_4_ = 0xffffff81;
                          auVar242._0_8_ = 0xffffff81ffffff81;
                          auVar242._12_4_ = 0xffffff81;
                          local_598._0_4_ = auVar137._0_4_;
                          _local_588 = ZEXT416((uint)auVar119._0_4_);
                          auVar138._0_4_ = fVar221 * (float)local_4f8._0_4_;
                          auVar138._4_4_ = fVar221 * (float)local_4f8._4_4_;
                          auVar138._8_4_ = fVar221 * fStack_4f0;
                          auVar138._12_4_ = fVar221 * fStack_4ec;
                          auVar16._8_4_ = 0x3fb8aa3b;
                          auVar16._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar16._12_4_ = 0x3fb8aa3b;
                          auVar123 = vmulps_avx512vl(auVar138,auVar16);
                          auVar137 = vroundps_avx(auVar123,9);
                          auVar123 = vsubps_avx(auVar123,auVar137);
                          auVar17._8_4_ = 0x3e679a0b;
                          auVar17._0_8_ = 0x3e679a0b3e679a0b;
                          auVar17._12_4_ = 0x3e679a0b;
                          auVar121 = vfmadd213ps_avx512vl(auVar226,auVar123,auVar17);
                          auVar185._0_4_ = (int)auVar137._0_4_;
                          auVar185._4_4_ = (int)auVar137._4_4_;
                          auVar185._8_4_ = (int)auVar137._8_4_;
                          auVar185._12_4_ = (int)auVar137._12_4_;
                          auVar137 = vpaddd_avx(auVar185,auVar242);
                          auVar18._8_4_ = 0x3f321004;
                          auVar18._0_8_ = 0x3f3210043f321004;
                          auVar18._12_4_ = 0x3f321004;
                          auVar121 = vfmadd213ps_avx512vl(auVar121,auVar123,auVar18);
                          auVar123 = vfmadd213ps_fma(auVar121,auVar123,local_618);
                          auVar121 = vpsrld_avx(auVar123,0x17);
                          auVar137 = vpaddd_avx(auVar137,auVar121);
                          auVar19._8_4_ = 0x807fffff;
                          auVar19._0_8_ = 0x807fffff807fffff;
                          auVar19._12_4_ = 0x807fffff;
                          auVar123 = vpandd_avx512vl(auVar123,auVar19);
                          auVar20._8_4_ = 0x7f;
                          auVar20._0_8_ = 0x7f0000007f;
                          auVar20._12_4_ = 0x7f;
                          uVar103 = vpcmpgtd_avx512vl(auVar137,auVar20);
                          uVar103 = uVar103 & 0xf;
                          uVar105 = vpcmpgtd_avx512vl(auVar137,auVar242);
                          uVar105 = uVar105 & 0xf;
                          auVar137 = vpslld_avx(auVar137,0x17);
                          auVar21._8_4_ = 0x3f800000;
                          auVar21._0_8_ = 0x3f8000003f800000;
                          auVar21._12_4_ = 0x3f800000;
                          auVar137 = vpaddd_avx512vl(auVar137,auVar21);
                          auVar137 = vpord_avx512vl(auVar137,auVar123);
                          auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                          bVar91 = (bool)((byte)uVar103 & 1);
                          bVar7 = (bool)((byte)(uVar103 >> 1) & 1);
                          bVar5 = (bool)((byte)(uVar103 >> 2) & 1);
                          bVar6 = SUB81(uVar103 >> 3,0);
                          auVar186._0_4_ = auVar119._0_4_ * fStack_5bc + (float)local_5c8._0_8_;
                          auVar186._4_4_ =
                               auVar119._0_4_ * (float)uStack_5b8 + SUB84(local_5c8._0_8_,4);
                          auVar186._8_4_ = auVar119._0_4_ * 0.0 + 0.0;
                          auVar186._12_4_ = auVar119._0_4_ * 0.0 + 0.0;
                          auVar219 = ZEXT856(auVar186._8_8_);
                          local_468._4_4_ =
                               (uint)bVar7 * auVar123._4_4_ |
                               (uint)!bVar7 * (uint)((byte)(uVar105 >> 1) & 1) * auVar137._4_4_;
                          local_468._0_4_ =
                               (uint)bVar91 * auVar123._0_4_ |
                               (uint)!bVar91 * (uint)((byte)uVar105 & 1) * auVar137._0_4_;
                          fStack_460 = (float)((uint)bVar5 * auVar123._8_4_ |
                                              (uint)!bVar5 *
                                              (uint)((byte)(uVar105 >> 2) & 1) * auVar137._8_4_);
                          fStack_45c = (float)((uint)bVar6 * auVar123._12_4_ |
                                              (uint)!bVar6 *
                                              (uint)(byte)(uVar105 >> 3) * auVar137._12_4_);
                          local_600._0_8_ = vmovlps_avx(auVar186);
                          local_600.z = auVar119._0_4_ * uStack_5b8._4_4_ + (float)local_5c8._8_4_;
                          auVar174 = (undefined1  [56])0x0;
                          SVar297 = UniformGridMediumProvider::Density
                                              ((UniformGridMediumProvider *)*puVar112,
                                               (Point3f *)&local_600,pSVar114);
                          auVar208._0_8_ = SVar297.values.values._8_8_;
                          auVar208._8_56_ = auVar219;
                          auVar163._0_8_ = SVar297.values.values._0_8_;
                          auVar163._8_56_ = auVar174;
                          _local_478 = vmovlhps_avx(auVar163._0_16_,auVar208._0_16_);
                          p.super_Tuple3<pbrt::Point3,_float>.z = local_600.z;
                          p.super_Tuple3<pbrt::Point3,_float>.x = local_600.x;
                          p.super_Tuple3<pbrt::Point3,_float>.y = local_600.y;
                          auVar219 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                          auVar174 = ZEXT856(0);
                          SVar297 = UniformGridMediumProvider::Le
                                              ((UniformGridMediumProvider *)*puVar112,p,pSVar114);
                          auVar209._0_8_ = SVar297.values.values._8_8_;
                          auVar209._8_56_ = auVar219;
                          auVar164._0_8_ = SVar297.values.values._0_8_;
                          auVar164._8_56_ = auVar174;
                          auVar295 = ZEXT1664(CONCAT412(0x80000000,
                                                        CONCAT48(0x80000000,0x8000000080000000)));
                          local_2f8.values.values[0] = (float)local_478._0_4_ * local_418;
                          local_2f8.values.values[1] = (float)local_478._4_4_ * fStack_414;
                          local_2f8.values.values[2] = fStack_470 * fStack_410;
                          local_2f8.values.values[3] = fStack_46c * fStack_40c;
                          local_2c8.values.values[0] =
                               (float)local_468._0_4_ * (float)local_5d8._0_4_;
                          local_2c8.values.values[1] =
                               (float)local_468._4_4_ * (float)local_5d8._4_4_;
                          local_2c8.values.values[2] = fStack_460 * (float)uStack_5d0;
                          local_2c8.values.values[3] = fStack_45c * uStack_5d0._4_4_;
                          auVar119 = vfmadd231ss_fma(ZEXT416((uint)(local_600.y *
                                                                   *(float *)((long)puVar112 + 0x7c)
                                                                   )),ZEXT416((uint)local_600.x),
                                                     ZEXT416(*(uint *)(puVar112 + 0xf)));
                          auVar137 = vfmadd231ss_fma(ZEXT416((uint)(local_600.y *
                                                                   *(float *)((long)puVar112 + 0xac)
                                                                   )),ZEXT416((uint)local_600.x),
                                                     ZEXT416(*(uint *)(puVar112 + 0x15)));
                          auVar123 = vfmadd231ss_fma(ZEXT416((uint)(local_600.y *
                                                                   *(float *)((long)puVar112 + 0x8c)
                                                                   )),ZEXT416((uint)local_600.x),
                                                     ZEXT416(*(uint *)(puVar112 + 0x11)));
                          auVar121 = vfmadd231ss_fma(ZEXT416((uint)(local_600.y *
                                                                   *(float *)((long)puVar112 + 0x9c)
                                                                   )),ZEXT416((uint)local_600.x),
                                                     ZEXT416(*(uint *)(puVar112 + 0x13)));
                          auVar128 = vfmadd231ss_fma(auVar119,ZEXT416((uint)local_600.z),
                                                     ZEXT416(*(uint *)(puVar112 + 0x10)));
                          auVar119 = vfmadd231ss_fma(auVar137,ZEXT416((uint)local_600.z),
                                                     ZEXT416(*(uint *)(puVar112 + 0x16)));
                          auVar137 = vfmadd231ss_fma(auVar123,ZEXT416((uint)local_600.z),
                                                     ZEXT416(*(uint *)(puVar112 + 0x12)));
                          auVar123 = vfmadd231ss_fma(auVar121,ZEXT416((uint)local_600.z),
                                                     ZEXT416(*(uint *)(puVar112 + 0x14)));
                          auVar119._0_4_ = auVar119._0_4_ + *(float *)((long)puVar112 + 0xb4);
                          fVar221 = auVar128._0_4_ + *(float *)((long)puVar112 + 0x84);
                          fVar248 = auVar137._0_4_ + *(float *)((long)puVar112 + 0x94);
                          fVar237 = auVar123._0_4_ + *(float *)((long)puVar112 + 0xa4);
                          bVar91 = auVar119._0_4_ == 1.0;
                          iVar117 = (uint)bVar91 * (int)fVar221 +
                                    (uint)!bVar91 * (int)(fVar221 / auVar119._0_4_);
                          iVar118 = (uint)bVar91 * (int)fVar237 +
                                    (uint)!bVar91 * (int)(fVar237 / auVar119._0_4_);
                          iVar101 = (uint)bVar91 * (int)fVar248 +
                                    (uint)!bVar91 * (int)(fVar248 / auVar119._0_4_);
                          auVar272._4_4_ = iVar117;
                          auVar272._0_4_ = iVar117;
                          auVar272._8_4_ = iVar117;
                          auVar272._12_4_ = iVar117;
                          auVar278._4_4_ = iVar101;
                          auVar278._0_4_ = iVar101;
                          auVar278._8_4_ = iVar101;
                          auVar278._12_4_ = iVar101;
                          auVar261._4_4_ = iVar118;
                          auVar261._0_4_ = iVar118;
                          auVar261._8_4_ = iVar118;
                          auVar261._12_4_ = iVar118;
                          auVar137 = vmovlhps_avx(auVar272,auVar278);
                          local_338 = ZEXT416(0) << 0x20;
                          auVar288._0_4_ = local_440._12_4_ * local_440._12_4_;
                          auVar288._4_4_ = local_440._16_4_ * local_440._16_4_;
                          auVar288._8_8_ = 0;
                          auVar284._0_8_ = local_440._12_8_ ^ 0x8000000080000000;
                          auVar284._8_4_ = 0x80000000;
                          auVar284._12_4_ = 0x80000000;
                          auVar119 = vhaddps_avx(auVar288,auVar288);
                          auVar119 = ZEXT416((uint)(auVar119._0_4_ + fStack_42c * fStack_42c));
                          auVar119 = vsqrtss_avx(auVar119,auVar119);
                          local_2e8._16_16_ = vmovlhps_avx(auVar164._0_16_,auVar209._0_16_);
                          fStack_33c = auVar119._0_4_;
                          auVar293._4_4_ = fStack_33c;
                          auVar293._0_4_ = fStack_33c;
                          auVar293._8_4_ = fStack_33c;
                          auVar293._12_4_ = fStack_33c;
                          fStack_33c = -fStack_42c / fStack_33c;
                          auVar119 = vdivps_avx(auVar284,auVar293);
                          local_328 = 0.0;
                          local_360._0_8_ = auVar137._0_8_;
                          local_360._8_4_ = auVar137._8_4_;
                          local_360._12_4_ = auVar137._12_4_;
                          local_360._16_8_ = vmovlps_avx(auVar261);
                          local_360._24_4_ = FStack_428;
                          uVar177 = vmovlps_avx(auVar119);
                          fStack_344 = (float)uVar177;
                          fStack_340 = (float)((ulong)uVar177 >> 0x20);
                          local_320 = (MediumInterface *)0x0;
                          local_318.bits = TVar89.bits;
                          local_308.values.values[1] =
                               (float)local_478._4_4_ * (float)local_488._4_4_;
                          local_308.values.values[0] =
                               (float)local_478._0_4_ * (float)local_488._0_4_;
                          local_308.values.values[2] = fStack_470 * fStack_480;
                          local_308.values.values[3] = fStack_46c * fStack_47c;
                          local_2e8._0_16_ = _local_568;
                          local_310.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                               (TaggedPointer<pbrt::HGPhaseFunction>)
                               (TaggedPointer<pbrt::HGPhaseFunction>)
                               ((long)puVar112 + 0x74U | 0x1000000000000);
                          bVar91 = SampleLd::anon_class_32_4_3820c045::operator()
                                             (&local_3d0,(MediumSample *)local_360);
                          if (!bVar91) goto LAB_003cf15b;
                          auVar269 = ZEXT464((uint)local_598._0_4_);
                          auVar292 = ZEXT1664(_local_588);
                          _local_5d8 = local_618;
                        }
                      }
                      auVar119._0_4_ = local_534[3] - (float)local_588._0_4_;
                      auVar227._8_4_ = 0x3da00ac9;
                      auVar227._0_8_ = 0x3da00ac93da00ac9;
                      auVar227._12_4_ = 0x3da00ac9;
                      auVar243._8_4_ = 0xffffff81;
                      auVar243._0_8_ = 0xffffff81ffffff81;
                      auVar243._12_4_ = 0xffffff81;
                      auVar283 = ZEXT464((uint)local_4b8._0_4_);
                      auVar236 = ZEXT1664(local_3e8);
                      auVar139._0_4_ = auVar119._0_4_ * (float)local_4f8._0_4_;
                      auVar139._4_4_ = auVar119._0_4_ * (float)local_4f8._4_4_;
                      auVar139._8_4_ = auVar119._0_4_ * fStack_4f0;
                      auVar139._12_4_ = auVar119._0_4_ * fStack_4ec;
                      auVar22._8_4_ = 0x3fb8aa3b;
                      auVar22._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar22._12_4_ = 0x3fb8aa3b;
                      auVar137 = vmulps_avx512vl(auVar139,auVar22);
                      auVar119 = vroundps_avx(auVar137,9);
                      auVar137 = vsubps_avx(auVar137,auVar119);
                      auVar23._8_4_ = 0x3e679a0b;
                      auVar23._0_8_ = 0x3e679a0b3e679a0b;
                      auVar23._12_4_ = 0x3e679a0b;
                      auVar123 = vfmadd213ps_avx512vl(auVar227,auVar137,auVar23);
                      auVar187._0_4_ = (int)auVar119._0_4_;
                      auVar187._4_4_ = (int)auVar119._4_4_;
                      auVar187._8_4_ = (int)auVar119._8_4_;
                      auVar187._12_4_ = (int)auVar119._12_4_;
                      auVar119 = vpaddd_avx(auVar187,auVar243);
                      auVar24._8_4_ = 0x3f321004;
                      auVar24._0_8_ = 0x3f3210043f321004;
                      auVar24._12_4_ = 0x3f321004;
                      auVar123 = vfmadd213ps_avx512vl(auVar123,auVar137,auVar24);
                      auVar137 = vfmadd213ps_fma(auVar123,auVar137,local_618);
                      auVar123 = vpsrld_avx(auVar137,0x17);
                      auVar119 = vpaddd_avx(auVar119,auVar123);
                      auVar25._8_4_ = 0x7f;
                      auVar25._0_8_ = 0x7f0000007f;
                      auVar25._12_4_ = 0x7f;
                      uVar105 = vpcmpgtd_avx512vl(auVar119,auVar25);
                      auVar26._8_4_ = 0x807fffff;
                      auVar26._0_8_ = 0x807fffff807fffff;
                      auVar26._12_4_ = 0x807fffff;
                      auVar121 = vpandd_avx512vl(auVar137,auVar26);
                      uVar103 = vpcmpgtd_avx512vl(auVar119,auVar243);
                      auVar119 = vpslld_avx(auVar119,0x17);
                      auVar27._8_4_ = 0x3f800000;
                      auVar27._0_8_ = 0x3f8000003f800000;
                      auVar27._12_4_ = 0x3f800000;
                      auVar123 = vpaddd_avx512vl(auVar119,auVar27);
                      auVar119._0_4_ = local_558._0_4_;
                      auVar137 = _local_5d8;
                    }
                    else {
                      fVar248 = auVar123._0_4_ - auVar137._0_4_;
                      auVar225._8_4_ = 0x3da00ac9;
                      auVar225._0_8_ = 0x3da00ac93da00ac9;
                      auVar225._12_4_ = 0x3da00ac9;
                      auVar251._8_4_ = 0xffffff81;
                      auVar251._0_8_ = 0xffffff81ffffff81;
                      auVar251._12_4_ = 0xffffff81;
                      auVar136._0_4_ = fVar248 * -fVar221;
                      auVar136._4_4_ = fVar248 * -auVar121._4_4_;
                      auVar136._8_4_ = fVar248 * -auVar121._8_4_;
                      auVar136._12_4_ = fVar248 * -auVar121._12_4_;
                      auVar10._8_4_ = 0x3fb8aa3b;
                      auVar10._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar10._12_4_ = 0x3fb8aa3b;
                      auVar123 = vmulps_avx512vl(auVar136,auVar10);
                      auVar137 = vroundps_avx(auVar123,9);
                      auVar123 = vsubps_avx(auVar123,auVar137);
                      auVar11._8_4_ = 0x3e679a0b;
                      auVar11._0_8_ = 0x3e679a0b3e679a0b;
                      auVar11._12_4_ = 0x3e679a0b;
                      auVar121 = vfmadd213ps_avx512vl(auVar225,auVar123,auVar11);
                      auVar184._0_4_ = (int)auVar137._0_4_;
                      auVar184._4_4_ = (int)auVar137._4_4_;
                      auVar184._8_4_ = (int)auVar137._8_4_;
                      auVar184._12_4_ = (int)auVar137._12_4_;
                      auVar137 = vpaddd_avx(auVar184,auVar251);
                      auVar12._8_4_ = 0x3f321004;
                      auVar12._0_8_ = 0x3f3210043f321004;
                      auVar12._12_4_ = 0x3f321004;
                      auVar121 = vfmadd213ps_avx512vl(auVar121,auVar123,auVar12);
                      auVar123 = vfmadd213ps_fma(auVar121,auVar123,local_618);
                      auVar121 = vpsrld_avx(auVar123,0x17);
                      auVar137 = vpaddd_avx(auVar137,auVar121);
                      auVar13._8_4_ = 0x7f;
                      auVar13._0_8_ = 0x7f0000007f;
                      auVar13._12_4_ = 0x7f;
                      uVar105 = vpcmpgtd_avx512vl(auVar137,auVar13);
                      auVar14._8_4_ = 0x807fffff;
                      auVar14._0_8_ = 0x807fffff807fffff;
                      auVar14._12_4_ = 0x807fffff;
                      auVar121 = vpandd_avx512vl(auVar123,auVar14);
                      uVar103 = vpcmpgtd_avx512vl(auVar137,auVar251);
                      auVar137 = vpslld_avx(auVar137,0x17);
                      auVar15._8_4_ = 0x3f800000;
                      auVar15._0_8_ = 0x3f8000003f800000;
                      auVar15._12_4_ = 0x3f800000;
                      auVar123 = vpaddd_avx512vl(auVar137,auVar15);
                      auVar137 = auVar120;
                    }
                    uVar105 = uVar105 & 0xf;
                    uVar103 = uVar103 & 0xf;
                    auVar123 = vpord_avx512vl(auVar123,auVar121);
                    auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    bVar91 = (bool)((byte)uVar105 & 1);
                    bVar7 = (bool)((byte)(uVar105 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar105 >> 2) & 1);
                    bVar6 = SUB81(uVar105 >> 3,0);
                    auVar120._0_4_ =
                         (float)((uint)bVar91 * auVar121._0_4_ |
                                (uint)!bVar91 * (uint)((byte)uVar103 & 1) * auVar123._0_4_) *
                         auVar137._0_4_;
                    auVar120._4_4_ =
                         (float)((uint)bVar7 * auVar121._4_4_ |
                                (uint)!bVar7 * (uint)((byte)(uVar103 >> 1) & 1) * auVar123._4_4_) *
                         auVar137._4_4_;
                    auVar120._8_4_ =
                         (float)((uint)bVar5 * auVar121._8_4_ |
                                (uint)!bVar5 * (uint)((byte)(uVar103 >> 2) & 1) * auVar123._8_4_) *
                         auVar137._8_4_;
                    auVar120._12_4_ =
                         (float)((uint)bVar6 * auVar121._12_4_ |
                                (uint)!bVar6 * (uint)(byte)(uVar103 >> 3) * auVar123._12_4_) *
                         auVar137._12_4_;
                    if ((auVar283._0_4_ < auVar119._0_4_) ||
                       (iVar117 = local_5f0[lVar109], iVar118 = local_54c[lVar109 + 3],
                       local_5f0[lVar109] = iVar117 + iVar118, piVar1 = local_498,
                       iVar117 + iVar118 == local_54c[lVar109])) break;
                    auVar87 = local_508;
                    auVar137 = auVar295._0_16_;
                    local_5e4[lVar109] = auVar119._0_4_ + local_534[lVar109];
                    iVar118 = *(int *)auVar87;
                    iVar117 = *piVar1;
                  }
                  goto LAB_003cfc73;
                }
                local_5c8._0_8_ = &local_4c8;
                unique0x00005300 = &local_4e8;
                uStack_5b8 = &local_458;
                this_00 = (DenselySampledSpectrum *)(local_298.bits & 0xffffffffffff);
                local_468._0_4_ = IStack_2b0.low;
                pRStack_5b0 = &local_578;
                iVar117 = this_00[3].lambda_min;
                local_588._4_4_ = iVar117;
                local_588._0_4_ = iVar117;
                fStack_580 = (float)iVar117;
                fStack_57c = (float)iVar117;
                auVar174 = ZEXT856(local_588._8_8_);
                auVar219 = ZEXT856(0);
                auVar295 = ZEXT1664(auVar119);
                _local_5d8 = auVar178;
                _local_568 = auVar250;
                local_534[3] = (float)uVar256;
                _local_478 = auVar238;
                SVar297 = DenselySampledSpectrum::Sample(this_00,pSVar114);
                auVar204._0_8_ = SVar297.values.values._8_8_;
                auVar204._8_56_ = auVar219;
                auVar159._0_8_ = SVar297.values.values._0_8_;
                auVar159._8_56_ = auVar174;
                auVar119 = vmovlhps_avx(auVar159._0_16_,auVar204._0_16_);
                local_588._4_4_ = auVar119._4_4_ * (float)local_588._4_4_;
                local_588._0_4_ = auVar119._0_4_ * (float)local_588._0_4_;
                fStack_580 = auVar119._8_4_ * fStack_580;
                fStack_57c = auVar119._12_4_ * fStack_57c;
                iVar117 = this_00[3].lambda_min;
                auVar131._4_4_ = iVar117;
                auVar131._0_4_ = iVar117;
                auVar131._8_4_ = iVar117;
                auVar131._12_4_ = iVar117;
                auVar174 = ZEXT856(auVar131._8_8_);
                _local_4b8 = auVar131;
                SVar297 = DenselySampledSpectrum::Sample(this_00 + 1,pSVar114);
                auVar205._0_8_ = SVar297.values.values._8_8_;
                auVar205._8_56_ = auVar219;
                auVar160._0_8_ = SVar297.values.values._0_8_;
                auVar160._8_56_ = auVar174;
                auVar223._0_4_ = (float)local_568._0_4_ * (float)local_568._0_4_;
                auVar223._4_4_ = (float)local_568._4_4_ * (float)local_568._4_4_;
                auVar223._8_4_ = fStack_560 * fStack_560;
                auVar223._12_4_ = fStack_55c * fStack_55c;
                auVar119 = vhaddps_avx(auVar223,auVar223);
                auVar119 = ZEXT416((uint)((float)local_5d8._0_4_ * (float)local_5d8._0_4_ +
                                         auVar119._0_4_));
                auVar137 = vsqrtss_avx(auVar119,auVar119);
                auVar119 = vmovlhps_avx(auVar160._0_16_,auVar205._0_16_);
                fVar221 = auVar119._0_4_ * (float)local_4b8._0_4_;
                fVar248 = auVar119._4_4_ * (float)local_4b8._4_4_;
                fVar237 = auVar119._8_4_ * (float)uStack_4b0;
                fVar249 = auVar119._12_4_ * uStack_4b0._4_4_;
                auVar119._0_4_ = auVar137._0_4_ * local_534[3];
                fVar257 = fVar221 + (float)local_588._0_4_;
                fVar218 = fVar248 + (float)local_588._4_4_;
                fVar270 = fVar237 + fStack_580;
                fVar220 = fVar249 + fStack_57c;
                bVar91 = ABS(auVar119._0_4_) == INFINITY;
                uVar92 = (uint)bVar91 * 0x7f7fffff + (uint)!bVar91 * (int)auVar119._0_4_;
                if ((fVar257 != 0.0) || (NAN(fVar257))) {
                  _local_4b8 = ZEXT1632(CONCAT412(fVar220,CONCAT48(fVar270,CONCAT44(fVar218,fVar257)
                                                                  )));
                  auVar119._0_4_ = 1.0 - (float)local_598._0_4_;
                  local_598 = ZEXT416(uVar92);
                  auVar295 = ZEXT1664(auVar295._0_16_);
                  local_534[3] = fVar221;
                  fStack_524 = fVar248;
                  fStack_520 = fVar237;
                  fStack_51c = fVar249;
                  _local_4f8 = auVar137;
                  auVar119._0_4_ = logf(auVar119._0_4_);
                  fVar221 = local_4b8._0_4_;
                  auVar119._0_4_ = -auVar119._0_4_ / fVar221;
                  if ((float)local_598._0_4_ <= auVar119._0_4_) {
                    auVar235._8_4_ = 0x3da00ac9;
                    auVar235._0_8_ = 0x3da00ac93da00ac9;
                    auVar235._12_4_ = 0x3da00ac9;
                    auVar255._8_4_ = 0xffffff81;
                    auVar255._0_8_ = 0xffffff81ffffff81;
                    auVar255._12_4_ = 0xffffff81;
                    local_88._0_4_ = fVar221 * -(float)local_598._0_4_;
                    local_88._4_4_ = local_4b8._4_4_ * -(float)local_598._0_4_;
                    local_88._8_4_ = local_4b8._8_4_ * -(float)local_598._0_4_;
                    local_88._12_4_ = local_4b8._12_4_ * -(float)local_598._0_4_;
                    auVar41._8_4_ = 0x3fb8aa3b;
                    auVar41._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar41._12_4_ = 0x3fb8aa3b;
                    auVar137 = vmulps_avx512vl(local_88,auVar41);
                    auVar119 = vroundps_avx(auVar137,9);
                    auVar137 = vsubps_avx(auVar137,auVar119);
                    auVar42._8_4_ = 0x3e679a0b;
                    auVar42._0_8_ = 0x3e679a0b3e679a0b;
                    auVar42._12_4_ = 0x3e679a0b;
                    auVar123 = vfmadd213ps_avx512vl(auVar235,auVar137,auVar42);
                    auVar200._0_4_ = (int)auVar119._0_4_;
                    auVar200._4_4_ = (int)auVar119._4_4_;
                    auVar200._8_4_ = (int)auVar119._8_4_;
                    auVar200._12_4_ = (int)auVar119._12_4_;
                    auVar119 = vpaddd_avx(auVar200,auVar255);
                    auVar43._8_4_ = 0x3f321004;
                    auVar43._0_8_ = 0x3f3210043f321004;
                    auVar43._12_4_ = 0x3f321004;
                    auVar123 = vfmadd213ps_avx512vl(auVar123,auVar137,auVar43);
                    auVar137 = vfmadd213ps_fma(auVar123,auVar137,local_618);
                    auVar123 = vpsrld_avx(auVar137,0x17);
                    auVar119 = vpaddd_avx(auVar119,auVar123);
                    auVar44._8_4_ = 0x807fffff;
                    auVar44._0_8_ = 0x807fffff807fffff;
                    auVar44._12_4_ = 0x807fffff;
                    auVar137 = vpandd_avx512vl(auVar137,auVar44);
                    auVar45._8_4_ = 0x7f;
                    auVar45._0_8_ = 0x7f0000007f;
                    auVar45._12_4_ = 0x7f;
                    uVar103 = vpcmpgtd_avx512vl(auVar119,auVar45);
                    uVar103 = uVar103 & 0xf;
                    uVar105 = vpcmpgtd_avx512vl(auVar119,auVar255);
                    uVar105 = uVar105 & 0xf;
                    auVar119 = vpslld_avx(auVar119,0x17);
                    auVar46._8_4_ = 0x3f800000;
                    auVar46._0_8_ = 0x3f8000003f800000;
                    auVar46._12_4_ = 0x3f800000;
                    auVar119 = vpaddd_avx512vl(auVar119,auVar46);
                    auVar119 = vpord_avx512vl(auVar119,auVar137);
                    auVar137 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    bVar91 = (bool)((byte)uVar103 & 1);
                    auVar120._0_4_ =
                         (float)((uint)bVar91 * auVar137._0_4_ |
                                (uint)!bVar91 * (uint)((byte)uVar105 & 1) * auVar119._0_4_);
                    bVar91 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar120._4_4_ =
                         (float)((uint)bVar91 * auVar137._4_4_ |
                                (uint)!bVar91 * (uint)((byte)(uVar105 >> 1) & 1) * auVar119._4_4_);
                    bVar91 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar120._8_4_ =
                         (float)((uint)bVar91 * auVar137._8_4_ |
                                (uint)!bVar91 * (uint)((byte)(uVar105 >> 2) & 1) * auVar119._8_4_);
                    bVar91 = SUB81(uVar103 >> 3,0);
                    auVar120._12_4_ =
                         (float)((uint)bVar91 * auVar137._12_4_ |
                                (uint)!bVar91 * (uint)(byte)(uVar105 >> 3) * auVar119._12_4_);
                    auVar119 = vshufpd_avx(auVar120,auVar120,1);
                    local_a8 = auVar120;
                    goto LAB_003d00a4;
                  }
                  local_598 = vpermilpd_avx(_local_588,1);
                  auVar150._4_4_ = local_4f8._0_4_;
                  auVar150._0_4_ = local_4f8._0_4_;
                  auVar150._8_4_ = local_4f8._0_4_;
                  auVar150._12_4_ = local_4f8._0_4_;
                  _local_488 = vdivps_avx(_local_568,auVar150);
                  auVar234._8_4_ = 0x3da00ac9;
                  auVar234._0_8_ = 0x3da00ac93da00ac9;
                  auVar234._12_4_ = 0x3da00ac9;
                  auVar254._8_4_ = 0xffffff81;
                  auVar254._0_8_ = 0xffffff81ffffff81;
                  auVar254._12_4_ = 0xffffff81;
                  local_98._0_4_ = fVar221 * -auVar119._0_4_;
                  local_98._4_4_ = local_4b8._4_4_ * -auVar119._0_4_;
                  local_98._8_4_ = local_4b8._8_4_ * -auVar119._0_4_;
                  local_98._12_4_ = local_4b8._12_4_ * -auVar119._0_4_;
                  auVar35._8_4_ = 0x3fb8aa3b;
                  auVar35._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar35._12_4_ = 0x3fb8aa3b;
                  auVar123 = vmulps_avx512vl(local_98,auVar35);
                  auVar137 = vroundps_avx(auVar123,9);
                  auVar123 = vsubps_avx(auVar123,auVar137);
                  auVar36._8_4_ = 0x3e679a0b;
                  auVar36._0_8_ = 0x3e679a0b3e679a0b;
                  auVar36._12_4_ = 0x3e679a0b;
                  auVar121 = vfmadd213ps_avx512vl(auVar234,auVar123,auVar36);
                  auVar197._0_4_ = (int)auVar137._0_4_;
                  auVar197._4_4_ = (int)auVar137._4_4_;
                  auVar197._8_4_ = (int)auVar137._8_4_;
                  auVar197._12_4_ = (int)auVar137._12_4_;
                  auVar137 = vpaddd_avx(auVar197,auVar254);
                  auVar37._8_4_ = 0x3f321004;
                  auVar37._0_8_ = 0x3f3210043f321004;
                  auVar37._12_4_ = 0x3f321004;
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar123,auVar37);
                  auVar123 = vfmadd213ps_fma(auVar121,auVar123,local_618);
                  auVar121 = vpsrld_avx(auVar123,0x17);
                  auVar137 = vpaddd_avx(auVar137,auVar121);
                  auVar38._8_4_ = 0x7f;
                  auVar38._0_8_ = 0x7f0000007f;
                  auVar38._12_4_ = 0x7f;
                  uVar103 = vpcmpgtd_avx512vl(auVar137,auVar38);
                  uVar103 = uVar103 & 0xf;
                  auVar39._8_4_ = 0x807fffff;
                  auVar39._0_8_ = 0x807fffff807fffff;
                  auVar39._12_4_ = 0x807fffff;
                  auVar123 = vpandd_avx512vl(auVar123,auVar39);
                  uVar105 = vpcmpgtd_avx512vl(auVar137,auVar254);
                  uVar105 = uVar105 & 0xf;
                  auVar137 = vpslld_avx(auVar137,0x17);
                  auVar40._8_4_ = 0x3f800000;
                  auVar40._0_8_ = 0x3f8000003f800000;
                  auVar40._12_4_ = 0x3f800000;
                  auVar137 = vpaddd_avx512vl(auVar137,auVar40);
                  auVar137 = vpord_avx512vl(auVar137,auVar123);
                  auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar91 = (bool)((byte)uVar103 & 1);
                  local_158.values[0] =
                       (uint)bVar91 * auVar121._0_4_ |
                       (uint)!bVar91 * (uint)((byte)uVar105 & 1) * auVar137._0_4_;
                  bVar91 = (bool)((byte)(uVar103 >> 1) & 1);
                  local_158.values[1] =
                       (uint)bVar91 * auVar121._4_4_ |
                       (uint)!bVar91 * (uint)((byte)(uVar105 >> 1) & 1) * auVar137._4_4_;
                  bVar91 = (bool)((byte)(uVar103 >> 2) & 1);
                  local_158.values[2] =
                       (uint)bVar91 * auVar121._8_4_ |
                       (uint)!bVar91 * (uint)((byte)(uVar105 >> 2) & 1) * auVar137._8_4_;
                  bVar91 = SUB81(uVar103 >> 3,0);
                  local_158.values[3] =
                       (float)((uint)bVar91 * auVar121._12_4_ |
                              (uint)!bVar91 * (uint)(byte)(uVar105 >> 3) * auVar137._12_4_);
                  local_4f8._4_4_ = local_5d8._4_4_;
                  local_4f8._0_4_ = (float)local_5d8._0_4_ / (float)local_4f8._0_4_;
                  fStack_4f0 = (float)uStack_5d0;
                  fStack_4ec = uStack_5d0._4_4_;
                  _local_568 = vshufpd_avx(local_4b8._0_16_,local_4b8._0_16_,1);
                  iVar117 = this_00[3].lambda_max;
                  local_508._4_4_ = iVar117;
                  local_508._0_4_ = iVar117;
                  fStack_500 = (float)iVar117;
                  fStack_4fc = (float)iVar117;
                  auVar174 = ZEXT856(local_508._8_8_);
                  auVar219 = ZEXT856(auVar123._8_8_);
                  auVar121 = auVar295._0_16_;
                  local_418 = auVar119._0_4_;
                  fStack_414 = -extraout_var._0_4_;
                  fStack_410 = -extraout_var._4_4_;
                  fStack_40c = -extraout_var._8_4_;
                  SVar297 = DenselySampledSpectrum::Sample(this_00 + 2,pSVar114);
                  auVar217._0_8_ = SVar297.values.values._8_8_;
                  auVar217._8_56_ = auVar219;
                  auVar172._0_8_ = SVar297.values.values._0_8_;
                  auVar172._8_56_ = auVar174;
                  auVar119 = vpunpcklqdq_avx(auVar172._0_16_,auVar217._0_16_);
                  auVar268._0_4_ = auVar119._0_4_ * (float)local_508._0_4_;
                  auVar268._4_4_ = auVar119._4_4_ * (float)local_508._4_4_;
                  auVar268._8_4_ = auVar119._8_4_ * fStack_500;
                  auVar268._12_4_ = auVar119._12_4_ * fStack_4fc;
                  local_318.bits = (uintptr_t)&this_00[0x66666666666].values.ptr;
                  local_310.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       ((ulong)&this_00[3].values | 0x1000000000000);
                  auVar137 = vmovshdup_avx(_local_488);
                  auVar119._0_4_ = (float)local_4f8._0_4_ * local_418 + (float)local_468._0_4_;
                  auVar287._0_8_ = local_488 ^ 0x8000000080000000;
                  auVar287._8_4_ = local_488._8_4_ ^ 0x80000000;
                  auVar287._12_4_ = local_488._12_4_ ^ 0x80000000;
                  fStack_33c = -(float)local_4f8._0_4_;
                  local_2f8.values.values[1] = fStack_524;
                  local_2f8.values.values[0] = local_534[3];
                  local_2f8.values.values[2] = fStack_520;
                  local_2f8.values.values[3] = fStack_51c;
                  local_58 = ZEXT1632(auVar268);
                  local_328 = 0.0;
                  fVar221 = local_478._0_4_ + local_488._0_4_ * local_418;
                  auVar123 = vmovshdup_avx(_local_478);
                  fVar248 = auVar123._0_4_ + auVar137._0_4_ * local_418;
                  auVar151._4_4_ = fVar221;
                  auVar151._0_4_ = fVar221;
                  auVar151._8_4_ = fVar221;
                  auVar151._12_4_ = fVar221;
                  auVar198._4_4_ = fVar248;
                  auVar198._0_4_ = fVar248;
                  auVar198._8_4_ = fVar248;
                  auVar198._12_4_ = fVar248;
                  auVar137 = vmovlhps_avx(auVar151,auVar198);
                  auVar199._4_4_ = auVar119._0_4_;
                  auVar199._0_4_ = auVar119._0_4_;
                  auVar199._8_4_ = auVar119._0_4_;
                  auVar199._12_4_ = auVar119._0_4_;
                  local_338._0_12_ = ZEXT812(0);
                  local_338._12_4_ = 0;
                  local_360._0_8_ = auVar137._0_8_;
                  local_360._8_4_ = auVar137._8_4_;
                  local_360._12_4_ = auVar137._12_4_;
                  local_360._16_8_ = vmovlps_avx(auVar199);
                  local_360._24_4_ = vextractps_avx(_local_5d8,1);
                  uVar177 = vmovlps_avx(auVar287);
                  fStack_344 = (float)uVar177;
                  fStack_340 = (float)((ulong)uVar177 >> 0x20);
                  local_320 = (MediumInterface *)0x0;
                  local_308.values.values = (array<float,_4>)vunpcklpd_avx(_local_588,local_598);
                  auVar153._0_16_ = local_4b8._0_16_;
                  auVar153._16_16_ = auVar268;
                  auVar202._16_16_ = _local_568;
                  auVar202._0_16_ = auVar153._0_16_;
                  auVar202 = vperm2f128_avx(auVar202,local_58,0x21);
                  local_2e8 = vshufpd_avx(auVar153,auVar202,8);
                  local_2c8.values.values = (array<float,_4>)(array<float,_4>)local_158.values;
                  auVar295 = ZEXT1664(auVar121);
                  SampleLd::anon_class_32_4_3820c045::operator()
                            ((anon_class_32_4_3820c045 *)local_5c8,(MediumSample *)local_360);
                  auVar236 = ZEXT1664(local_618);
                  auVar119 = local_618;
                  auVar120 = local_618;
                }
                else {
                  auVar132._4_4_ = uVar92;
                  auVar132._0_4_ = uVar92;
                  auVar132._8_4_ = uVar92;
                  auVar132._12_4_ = uVar92;
                  auVar28._8_4_ = 0x80000000;
                  auVar28._0_8_ = 0x8000000080000000;
                  auVar28._12_4_ = 0x80000000;
                  auVar119 = vxorps_avx512vl(auVar132,auVar28);
                  auVar224._8_4_ = 0x3da00ac9;
                  auVar224._0_8_ = 0x3da00ac93da00ac9;
                  auVar224._12_4_ = 0x3da00ac9;
                  auVar258._8_4_ = 0xffffff81;
                  auVar258._0_8_ = 0xffffff81ffffff81;
                  auVar258._12_4_ = 0xffffff81;
                  local_68._0_4_ = fVar257 * auVar119._0_4_;
                  local_68._4_4_ = fVar218 * auVar119._4_4_;
                  local_68._8_4_ = fVar270 * auVar119._8_4_;
                  local_68._12_4_ = fVar220 * auVar119._12_4_;
                  auVar29._8_4_ = 0x3fb8aa3b;
                  auVar29._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar29._12_4_ = 0x3fb8aa3b;
                  auVar137 = vmulps_avx512vl(local_68,auVar29);
                  auVar119 = vroundps_avx(auVar137,9);
                  auVar137 = vsubps_avx(auVar137,auVar119);
                  auVar30._8_4_ = 0x3e679a0b;
                  auVar30._0_8_ = 0x3e679a0b3e679a0b;
                  auVar30._12_4_ = 0x3e679a0b;
                  auVar123 = vfmadd213ps_avx512vl(auVar224,auVar137,auVar30);
                  auVar181._0_4_ = (int)auVar119._0_4_;
                  auVar181._4_4_ = (int)auVar119._4_4_;
                  auVar181._8_4_ = (int)auVar119._8_4_;
                  auVar181._12_4_ = (int)auVar119._12_4_;
                  auVar119 = vpaddd_avx(auVar181,auVar258);
                  auVar31._8_4_ = 0x3f321004;
                  auVar31._0_8_ = 0x3f3210043f321004;
                  auVar31._12_4_ = 0x3f321004;
                  auVar123 = vfmadd213ps_avx512vl(auVar123,auVar137,auVar31);
                  auVar137 = vfmadd213ps_fma(auVar123,auVar137,local_618);
                  auVar123 = vpsrld_avx(auVar137,0x17);
                  auVar119 = vpaddd_avx(auVar119,auVar123);
                  auVar32._8_4_ = 0x807fffff;
                  auVar32._0_8_ = 0x807fffff807fffff;
                  auVar32._12_4_ = 0x807fffff;
                  auVar137 = vpandd_avx512vl(auVar137,auVar32);
                  auVar33._8_4_ = 0x7f;
                  auVar33._0_8_ = 0x7f0000007f;
                  auVar33._12_4_ = 0x7f;
                  uVar103 = vpcmpgtd_avx512vl(auVar119,auVar33);
                  uVar103 = uVar103 & 0xf;
                  uVar105 = vpcmpgtd_avx512vl(auVar119,auVar258);
                  uVar105 = uVar105 & 0xf;
                  auVar119 = vpslld_avx(auVar119,0x17);
                  auVar34._8_4_ = 0x3f800000;
                  auVar34._0_8_ = 0x3f8000003f800000;
                  auVar34._12_4_ = 0x3f800000;
                  auVar119 = vpaddd_avx512vl(auVar119,auVar34);
                  auVar119 = vpord_avx512vl(auVar119,auVar137);
                  auVar137 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar91 = (bool)((byte)uVar103 & 1);
                  auVar120._0_4_ =
                       (float)((uint)bVar91 * auVar137._0_4_ |
                              (uint)!bVar91 * (uint)((byte)uVar105 & 1) * auVar119._0_4_);
                  bVar91 = (bool)((byte)(uVar103 >> 1) & 1);
                  auVar120._4_4_ =
                       (float)((uint)bVar91 * auVar137._4_4_ |
                              (uint)!bVar91 * (uint)((byte)(uVar105 >> 1) & 1) * auVar119._4_4_);
                  bVar91 = (bool)((byte)(uVar103 >> 2) & 1);
                  auVar120._8_4_ =
                       (float)((uint)bVar91 * auVar137._8_4_ |
                              (uint)!bVar91 * (uint)((byte)(uVar105 >> 2) & 1) * auVar119._8_4_);
                  bVar91 = SUB81(uVar103 >> 3,0);
                  auVar120._12_4_ =
                       (float)((uint)bVar91 * auVar137._12_4_ |
                              (uint)!bVar91 * (uint)(byte)(uVar105 >> 3) * auVar119._12_4_);
                  auVar119 = vshufpd_avx(auVar120,auVar120,1);
                  local_78 = auVar120;
LAB_003d00a4:
                  auVar236 = ZEXT1664(local_618);
                }
                goto LAB_003d00a8;
              }
              goto LAB_003d00e2;
            }
            auVar295 = ZEXT1664(auVar295._0_16_);
            PrimitiveHandle::Intersect
                      ((optional<pbrt::ShapeIntersection> *)local_268,(PrimitiveHandle *)pVVar116,
                       (Ray *)&local_2b8,0.9999);
            auVar119 = auVar295._0_16_;
            auVar236 = ZEXT1664(local_618);
            if ((local_168 & 1) == 0) goto LAB_003cd329;
            iVar117 = 1;
            if ((local_1a8 & (undefined1  [64])0xffffffffffff) == (undefined1  [64])0x0) {
              if ((float **)local_298.bits != (float **)0x0) {
                uVar256 = local_1a8._56_4_;
                goto LAB_003cd342;
              }
              goto LAB_003d00e2;
            }
            goto LAB_003d01b3;
          }
          goto LAB_003d01c4;
        }
      }
LAB_003d037a:
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
    }
  }
  else {
LAB_003d0339:
    uVar177 = 0;
    uVar222 = 0;
  }
LAB_003d033d:
  SVar297.values.values[2] = (float)(int)uVar177;
  SVar297.values.values[3] = (float)(int)((ulong)uVar177 >> 0x20);
  SVar297.values.values[0] = (float)(int)uVar222;
  SVar297.values.values[1] = (float)(int)((ulong)uVar222 >> 0x20);
  return (SampledSpectrum)SVar297.values.values;
LAB_003cf15b:
  auVar120 = local_618;
LAB_003cfc73:
  auVar236 = ZEXT1664(local_618);
  auVar119 = vshufpd_avx(auVar120,auVar120,1);
LAB_003d00a8:
  auVar119 = vunpcklpd_avx(auVar120,auVar119);
  local_4c8.values.values[0] = auVar119._0_4_ * local_4c8.values.values[0];
  fVar221 = auVar119._4_4_;
  local_4c8.values.values[1] = fVar221 * local_4c8.values.values[1];
  fVar248 = auVar119._8_4_;
  local_4c8.values.values[2] = fVar248 * local_4c8.values.values[2];
  fVar237 = auVar119._12_4_;
  local_4c8.values.values[3] = fVar237 * local_4c8.values.values[3];
  local_4e8.values.values[0] = auVar119._0_4_ * local_4e8.values.values[0];
  local_4e8.values.values[1] = fVar221 * local_4e8.values.values[1];
  local_4e8.values.values[2] = fVar248 * local_4e8.values.values[2];
  local_4e8.values.values[3] = fVar237 * local_4e8.values.values[3];
  local_458.values.values[1] = fVar221 * local_458.values.values[1];
  local_458.values.values[0] = auVar119._0_4_ * local_458.values.values[0];
  local_458.values.values[2] = fVar248 * local_458.values.values[2];
  local_458.values.values[3] = fVar237 * local_458.values.values[3];
LAB_003d00e2:
  if ((local_4c8.values.values[0] == 0.0) && (!NAN(local_4c8.values.values[0]))) {
    uVar103 = 0xffffffffffffffff;
    do {
      iVar117 = 1;
      if (uVar103 == 2) goto LAB_003d01b3;
      auVar119._0_4_ = local_4c8.values.values[uVar103 + 2];
      uVar103 = uVar103 + 1;
    } while ((auVar119._0_4_ == 0.0) && (!NAN(auVar119._0_4_)));
    if (2 < uVar103) goto LAB_003d01b3;
  }
  iVar117 = 3;
  if (local_168._0_1_ == true) {
    local_618 = auVar236._0_16_;
    if (local_b8 == '\0') goto LAB_003d037a;
    auVar295 = ZEXT1664(auVar295._0_16_);
    Interaction::SpawnRayTo((Ray *)local_360,(Interaction *)local_268,&local_108);
    auVar236 = ZEXT1664(local_618);
    local_298.bits._4_4_ = fStack_33c;
    local_298.bits._0_4_ = fStack_340;
    fStack_2a8 = (float)local_360._16_8_;
    fStack_2a4 = SUB84(local_360._16_8_,4);
    FStack_2a0 = (Float)local_360._24_4_;
    local_2b8.low = (Float)local_360._0_4_;
    local_2b8.high = (Float)local_360._4_4_;
    IStack_2b0.low = (Float)local_360._8_4_;
    IStack_2b0.high = (Float)local_360._12_4_;
    iVar117 = 0;
    IStack_2b0 = (Interval)local_360._8_8_;
  }
LAB_003d01b3:
  if (iVar117 != 0) goto code_r0x003d01bb;
  goto LAB_003cd239;
code_r0x003d01bb:
  if (iVar117 == 3) {
LAB_003d01c4:
    auVar295 = _local_268;
    local_4e8.values.values[0] =
         (float)local_148._0_4_ * (pathPDF->values).values[0] * local_4e8.values.values[0];
    local_4e8.values.values[1] =
         (float)local_148._0_4_ * (pathPDF->values).values[1] * local_4e8.values.values[1];
    local_4e8.values.values[2] =
         (float)local_148._0_4_ * (pathPDF->values).values[2] * local_4e8.values.values[2];
    local_4e8.values.values[3] =
         (float)local_148._0_4_ * (pathPDF->values).values[3] * local_4e8.values.values[3];
    local_458.values.values[0] =
         (float)local_278._0_4_ * (pathPDF->values).values[0] * local_458.values.values[0];
    local_458.values.values[1] =
         (float)local_278._0_4_ * (pathPDF->values).values[1] * local_458.values.values[1];
    local_458.values.values[2] =
         (float)local_278._0_4_ * (pathPDF->values).values[2] * local_458.values.values[2];
    local_458.values.values[3] =
         (float)local_278._0_4_ * (pathPDF->values).values[3] * local_458.values.values[3];
    if (*(uint *)((ulong)local_280 & 0xffffffffffff) < 2) {
      if (local_b8 == '\0') goto LAB_003d037a;
      lVar109 = 1;
      auVar152._0_4_ =
           local_378 * (local_288->values).values[0] * local_4c8.values.values[0] * local_128;
      auVar152._4_4_ =
           afStack_374[0] * (local_288->values).values[1] * local_4c8.values.values[1] *
           afStack_124[0];
      auVar152._8_4_ =
           afStack_374[1] * (local_288->values).values[2] * local_4c8.values.values[2] *
           afStack_124[1];
      auVar152._12_4_ =
           afStack_374[2] * (local_288->values).values[3] * local_4c8.values.values[3] *
           afStack_124[2];
      do {
        local_4e8.values.values[0] = local_4e8.values.values[0] + local_4e8.values.values[lVar109];
        lVar109 = lVar109 + 1;
      } while (lVar109 != 4);
    }
    else {
      if (local_b8 == '\0') goto LAB_003d037a;
      local_4e8.values.values[0] = local_458.values.values[0] + local_4e8.values.values[0];
      lVar109 = 1;
      auVar152._0_4_ =
           local_378 * (local_288->values).values[0] * local_4c8.values.values[0] * local_128;
      auVar152._4_4_ =
           afStack_374[0] * (local_288->values).values[1] * local_4c8.values.values[1] *
           afStack_124[0];
      auVar152._8_4_ =
           afStack_374[1] * (local_288->values).values[2] * local_4c8.values.values[2] *
           afStack_124[1];
      auVar152._12_4_ =
           afStack_374[2] * (local_288->values).values[3] * local_4c8.values.values[3] *
           afStack_124[2];
      afStack_264[0] = local_458.values.values[1] + local_4e8.values.values[1];
      local_268 = (undefined1  [4])local_4e8.values.values[0];
      afStack_264[1] = local_458.values.values[2] + local_4e8.values.values[2];
      _IStack_258 = auVar295._16_48_;
      afStack_264[2] = local_458.values.values[3] + local_4e8.values.values[3];
      do {
        local_4e8.values.values[0] =
             local_4e8.values.values[0] + *(float *)(local_268 + lVar109 * 4);
        lVar109 = lVar109 + 1;
      } while (lVar109 != 4);
    }
    local_4e8.values.values[0] = local_4e8.values.values[0] * 0.25;
    auVar201._4_4_ = local_4e8.values.values[0];
    auVar201._0_4_ = local_4e8.values.values[0];
    auVar201._8_4_ = local_4e8.values.values[0];
    auVar201._12_4_ = local_4e8.values.values[0];
    auVar119 = vdivps_avx(auVar152,auVar201);
    uVar222 = auVar119._0_8_;
    auVar119 = vshufpd_avx(auVar119,auVar119,1);
    uVar177 = auVar119._0_8_;
    goto LAB_003d033d;
  }
  goto LAB_003d0339;
}

Assistant:

SampledSpectrum VolPathIntegrator::SampleLd(const Interaction &intr, const BSDF *bsdf,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler,
                                            const SampledSpectrum &T_hat,
                                            const SampledSpectrum &pathPDF) const {
    // Estimate light-sampled direct illumination at _intr_
    // Initialize _LightSampleContext_ for volumetric light sampling
    LightSampleContext ctx;
    if (bsdf) {
        ctx = LightSampleContext(intr.AsSurface());
        // Try to nudge the light sampling position to correct side of the surface
        if (bsdf->HasReflection() && !bsdf->HasTransmission())
            ctx.pi = intr.OffsetRayOrigin(intr.wo);
        else if (bsdf->HasTransmission() && !bsdf->HasReflection())
            ctx.pi = intr.OffsetRayOrigin(-intr.wo);

    } else
        ctx = LightSampleContext(intr);

    // Sample a light source using _lightSampler_
    Float u = sampler.Get1D();
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(ctx, u);
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return SampledSpectrum(0.f);
    LightHandle light = sampledLight->light;
    CHECK(light != nullptr && sampledLight->pdf != 0);

    // Sample a point on the light source
    pstd::optional<LightLiSample> ls =
        light.SampleLi(ctx, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls->L || ls->pdf == 0)
        return SampledSpectrum(0.f);
    Float lightPDF = sampledLight->pdf * ls->pdf;

    // Evaluate BSDF or phase function for light sample direction
    Float scatterPDF;
    SampledSpectrum f_hat;
    Vector3f wo = intr.wo, wi = ls->wi;
    if (bsdf) {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the BSDF
        f_hat = bsdf->f(wo, wi) * AbsDot(wi, intr.AsSurface().shading.n);
        scatterPDF = bsdf->PDF(wo, wi);

    } else {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the phase function
        CHECK(intr.IsMediumInteraction());
        PhaseFunctionHandle phase = intr.AsMedium().phase;
        f_hat = SampledSpectrum(phase.p(wo, wi));
        scatterPDF = phase.PDF(wo, wi);
    }
    if (!f_hat)
        return SampledSpectrum(0.f);

    // Declare path state variables for ray to light source
    Ray lightRay = intr.SpawnRayTo(ls->pLight);
    SampledSpectrum T_ray(1.f), lightPathPDF(1.f), uniPathPDF(1.f);
    RNG rng(Hash(lightRay.o), Hash(lightRay.d));

    while (lightRay.d != Vector3f(0, 0, 0)) {
        // Trace ray through media to estimate transmittance
        pstd::optional<ShapeIntersection> si = Intersect(lightRay, 1 - ShadowEpsilon);
        // Handle opaque surface along ray's path
        if (si && si->intr.material)
            return SampledSpectrum(0.f);

        // Update transmittance for current ray segment
        if (lightRay.medium != nullptr) {
            Float tMax = si ? si->tHit : (1 - ShadowEpsilon);
            SampledSpectrum Tmaj = lightRay.medium.SampleTmaj(
                lightRay, tMax, rng.Uniform<Float>(), rng, lambda,
                [&](const MediumSample &mediumSample) {
                    // Update ray transmittance estimate at sampled point
                    // Update _T_ray_ and PDFs using ratio-tracking estimator
                    const MediumInteraction &intr = mediumSample.intr;
                    SampledSpectrum Tmaj = mediumSample.Tmaj, sigma_n = intr.sigma_n();
                    T_ray *= Tmaj * sigma_n;
                    lightPathPDF *= Tmaj * intr.sigma_maj;
                    uniPathPDF *= Tmaj * sigma_n;

                    // Possibly terminate transmittance computation using Russian roulette
                    SampledSpectrum Tr = T_ray / (lightPathPDF + uniPathPDF).Average();
                    if (Tr.MaxComponentValue() < 0.05f) {
                        Float q = 0.75f;
                        if (rng.Uniform<Float>() < q)
                            T_ray = SampledSpectrum(0.);
                        else {
                            lightPathPDF *= 1 - q;
                            uniPathPDF *= 1 - q;
                        }
                    }

                    if (!T_ray)
                        return false;
                    Rescale(T_ray, lightPathPDF, uniPathPDF);
                    return true;
                });
            // Update transmittance estimate for final unsampled segment
            T_ray *= Tmaj;
            lightPathPDF *= Tmaj;
            uniPathPDF *= Tmaj;
        }

        // Generate next ray segment or return final transmittance
        if (!T_ray)
            return SampledSpectrum(0.f);
        if (!si)
            break;
        lightRay = si->intr.SpawnRayTo(ls->pLight);
    }
    // Return path contribution function estimate for direct lighting
    lightPathPDF *= pathPDF * lightPDF;
    uniPathPDF *= pathPDF * scatterPDF;
    if (IsDeltaLight(light.Type()))
        return T_hat * f_hat * T_ray * ls->L / lightPathPDF.Average();
    else
        return T_hat * f_hat * T_ray * ls->L / (lightPathPDF + uniPathPDF).Average();
}